

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  uint uVar12;
  int iVar13;
  undefined4 uVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  long lVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  byte bVar99;
  byte bVar100;
  ulong uVar101;
  long lVar102;
  uint uVar103;
  uint uVar104;
  ulong uVar105;
  long lVar106;
  uint uVar107;
  long lVar108;
  ulong uVar109;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  Geometry *pGVar110;
  uint uVar111;
  byte bVar112;
  float fVar113;
  float fVar164;
  float fVar166;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar114;
  undefined1 auVar120 [16];
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  float fVar170;
  undefined4 uVar171;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined8 uVar172;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar192;
  float fVar193;
  float fVar202;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar200;
  float fVar201;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar203;
  float fVar208;
  float fVar209;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  undefined8 local_9a0;
  undefined8 uStack_998;
  RTCFilterFunctionNArguments local_990;
  Geometry *local_960;
  undefined1 (*local_958) [32];
  undefined1 local_950 [16];
  undefined1 local_940 [8];
  undefined8 uStack_938;
  undefined1 local_930 [16];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  LinearSpace3fa *local_7e8;
  undefined4 local_7e0;
  undefined4 uStack_7dc;
  undefined4 uStack_7d8;
  undefined4 uStack_7d4;
  undefined4 uStack_7d0;
  undefined4 uStack_7cc;
  undefined4 uStack_7c8;
  undefined4 uStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined4 local_6c0;
  int local_6bc;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  byte local_670;
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [64];
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar11 = prim[1];
  uVar105 = (ulong)(byte)PVar11;
  fVar203 = *(float *)(prim + uVar105 * 0x19 + 0x12);
  auVar30 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar116 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar185 = vinsertps_avx(auVar116,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar186 = vsubps_avx(auVar30,*(undefined1 (*) [16])(prim + uVar105 * 0x19 + 6));
  fVar192 = fVar203 * auVar186._0_4_;
  fVar170 = fVar203 * auVar185._0_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar105 * 4 + 6);
  auVar126 = vpmovsxbd_avx2(auVar30);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar105 * 5 + 6);
  auVar124 = vpmovsxbd_avx2(auVar116);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar105 * 6 + 6);
  auVar135 = vpmovsxbd_avx2(auVar117);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar105 * 0xb + 6);
  auVar134 = vpmovsxbd_avx2(auVar115);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6);
  auVar130 = vpmovsxbd_avx2(auVar6);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar127 = vcvtdq2ps_avx(auVar130);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (uint)(byte)PVar11 * 0xc + uVar105 + 6);
  auVar125 = vpmovsxbd_avx2(auVar7);
  auVar125 = vcvtdq2ps_avx(auVar125);
  uVar109 = (ulong)(uint)((int)(uVar105 * 9) * 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar109 + 6);
  auVar133 = vpmovsxbd_avx2(auVar8);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar109 + uVar105 + 6);
  auVar128 = vpmovsxbd_avx2(auVar9);
  auVar128 = vcvtdq2ps_avx(auVar128);
  uVar101 = (ulong)(uint)((int)(uVar105 * 5) << 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar101 + 6);
  auVar123 = vpmovsxbd_avx2(auVar10);
  auVar129 = vcvtdq2ps_avx(auVar123);
  auVar225._4_4_ = fVar170;
  auVar225._0_4_ = fVar170;
  auVar225._8_4_ = fVar170;
  auVar225._12_4_ = fVar170;
  auVar225._16_4_ = fVar170;
  auVar225._20_4_ = fVar170;
  auVar225._24_4_ = fVar170;
  auVar225._28_4_ = fVar170;
  auVar228._8_4_ = 1;
  auVar228._0_8_ = 0x100000001;
  auVar228._12_4_ = 1;
  auVar228._16_4_ = 1;
  auVar228._20_4_ = 1;
  auVar228._24_4_ = 1;
  auVar228._28_4_ = 1;
  auVar121 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar132 = ZEXT1632(CONCAT412(fVar203 * auVar185._12_4_,
                                CONCAT48(fVar203 * auVar185._8_4_,
                                         CONCAT44(fVar203 * auVar185._4_4_,fVar170))));
  auVar131 = vpermps_avx2(auVar228,auVar132);
  auVar122 = vpermps_avx512vl(auVar121,auVar132);
  fVar170 = auVar122._0_4_;
  fVar208 = auVar122._4_4_;
  auVar132._4_4_ = fVar208 * auVar135._4_4_;
  auVar132._0_4_ = fVar170 * auVar135._0_4_;
  fVar209 = auVar122._8_4_;
  auVar132._8_4_ = fVar209 * auVar135._8_4_;
  fVar193 = auVar122._12_4_;
  auVar132._12_4_ = fVar193 * auVar135._12_4_;
  fVar200 = auVar122._16_4_;
  auVar132._16_4_ = fVar200 * auVar135._16_4_;
  fVar201 = auVar122._20_4_;
  auVar132._20_4_ = fVar201 * auVar135._20_4_;
  fVar202 = auVar122._24_4_;
  auVar132._24_4_ = fVar202 * auVar135._24_4_;
  auVar132._28_4_ = auVar130._28_4_;
  auVar130._4_4_ = auVar125._4_4_ * fVar208;
  auVar130._0_4_ = auVar125._0_4_ * fVar170;
  auVar130._8_4_ = auVar125._8_4_ * fVar209;
  auVar130._12_4_ = auVar125._12_4_ * fVar193;
  auVar130._16_4_ = auVar125._16_4_ * fVar200;
  auVar130._20_4_ = auVar125._20_4_ * fVar201;
  auVar130._24_4_ = auVar125._24_4_ * fVar202;
  auVar130._28_4_ = auVar123._28_4_;
  auVar123._4_4_ = auVar129._4_4_ * fVar208;
  auVar123._0_4_ = auVar129._0_4_ * fVar170;
  auVar123._8_4_ = auVar129._8_4_ * fVar209;
  auVar123._12_4_ = auVar129._12_4_ * fVar193;
  auVar123._16_4_ = auVar129._16_4_ * fVar200;
  auVar123._20_4_ = auVar129._20_4_ * fVar201;
  auVar123._24_4_ = auVar129._24_4_ * fVar202;
  auVar123._28_4_ = auVar122._28_4_;
  auVar30 = vfmadd231ps_fma(auVar132,auVar131,auVar124);
  auVar116 = vfmadd231ps_fma(auVar130,auVar131,auVar127);
  auVar117 = vfmadd231ps_fma(auVar123,auVar128,auVar131);
  auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),auVar225,auVar126);
  auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar225,auVar134);
  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar133,auVar225);
  auVar226._4_4_ = fVar192;
  auVar226._0_4_ = fVar192;
  auVar226._8_4_ = fVar192;
  auVar226._12_4_ = fVar192;
  auVar226._16_4_ = fVar192;
  auVar226._20_4_ = fVar192;
  auVar226._24_4_ = fVar192;
  auVar226._28_4_ = fVar192;
  auVar123 = ZEXT1632(CONCAT412(fVar203 * auVar186._12_4_,
                                CONCAT48(fVar203 * auVar186._8_4_,
                                         CONCAT44(fVar203 * auVar186._4_4_,fVar192))));
  auVar130 = vpermps_avx2(auVar228,auVar123);
  auVar123 = vpermps_avx512vl(auVar121,auVar123);
  fVar203 = auVar123._0_4_;
  fVar170 = auVar123._4_4_;
  auVar131._4_4_ = fVar170 * auVar135._4_4_;
  auVar131._0_4_ = fVar203 * auVar135._0_4_;
  fVar208 = auVar123._8_4_;
  auVar131._8_4_ = fVar208 * auVar135._8_4_;
  fVar209 = auVar123._12_4_;
  auVar131._12_4_ = fVar209 * auVar135._12_4_;
  fVar193 = auVar123._16_4_;
  auVar131._16_4_ = fVar193 * auVar135._16_4_;
  fVar200 = auVar123._20_4_;
  auVar131._20_4_ = fVar200 * auVar135._20_4_;
  fVar201 = auVar123._24_4_;
  auVar131._24_4_ = fVar201 * auVar135._24_4_;
  auVar131._28_4_ = 1;
  auVar121._4_4_ = auVar125._4_4_ * fVar170;
  auVar121._0_4_ = auVar125._0_4_ * fVar203;
  auVar121._8_4_ = auVar125._8_4_ * fVar208;
  auVar121._12_4_ = auVar125._12_4_ * fVar209;
  auVar121._16_4_ = auVar125._16_4_ * fVar193;
  auVar121._20_4_ = auVar125._20_4_ * fVar200;
  auVar121._24_4_ = auVar125._24_4_ * fVar201;
  auVar121._28_4_ = auVar135._28_4_;
  auVar125._4_4_ = auVar129._4_4_ * fVar170;
  auVar125._0_4_ = auVar129._0_4_ * fVar203;
  auVar125._8_4_ = auVar129._8_4_ * fVar208;
  auVar125._12_4_ = auVar129._12_4_ * fVar209;
  auVar125._16_4_ = auVar129._16_4_ * fVar193;
  auVar125._20_4_ = auVar129._20_4_ * fVar200;
  auVar125._24_4_ = auVar129._24_4_ * fVar201;
  auVar125._28_4_ = auVar123._28_4_;
  auVar115 = vfmadd231ps_fma(auVar131,auVar130,auVar124);
  auVar6 = vfmadd231ps_fma(auVar121,auVar130,auVar127);
  auVar7 = vfmadd231ps_fma(auVar125,auVar130,auVar128);
  auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar226,auVar126);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar226,auVar134);
  auVar218._8_4_ = 0x7fffffff;
  auVar218._0_8_ = 0x7fffffff7fffffff;
  auVar218._12_4_ = 0x7fffffff;
  auVar218._16_4_ = 0x7fffffff;
  auVar218._20_4_ = 0x7fffffff;
  auVar218._24_4_ = 0x7fffffff;
  auVar218._28_4_ = 0x7fffffff;
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar226,auVar133);
  auVar126 = vandps_avx(ZEXT1632(auVar30),auVar218);
  auVar214._8_4_ = 0x219392ef;
  auVar214._0_8_ = 0x219392ef219392ef;
  auVar214._12_4_ = 0x219392ef;
  auVar214._16_4_ = 0x219392ef;
  auVar214._20_4_ = 0x219392ef;
  auVar214._24_4_ = 0x219392ef;
  auVar214._28_4_ = 0x219392ef;
  uVar109 = vcmpps_avx512vl(auVar126,auVar214,1);
  bVar16 = (bool)((byte)uVar109 & 1);
  auVar122._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar30._0_4_;
  bVar16 = (bool)((byte)(uVar109 >> 1) & 1);
  auVar122._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar30._4_4_;
  bVar16 = (bool)((byte)(uVar109 >> 2) & 1);
  auVar122._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar30._8_4_;
  bVar16 = (bool)((byte)(uVar109 >> 3) & 1);
  auVar122._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar30._12_4_;
  auVar122._16_4_ = (uint)((byte)(uVar109 >> 4) & 1) * 0x219392ef;
  auVar122._20_4_ = (uint)((byte)(uVar109 >> 5) & 1) * 0x219392ef;
  auVar122._24_4_ = (uint)((byte)(uVar109 >> 6) & 1) * 0x219392ef;
  auVar122._28_4_ = (uint)(byte)(uVar109 >> 7) * 0x219392ef;
  auVar126 = vandps_avx(ZEXT1632(auVar116),auVar218);
  uVar109 = vcmpps_avx512vl(auVar126,auVar214,1);
  bVar16 = (bool)((byte)uVar109 & 1);
  auVar146._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar116._0_4_;
  bVar16 = (bool)((byte)(uVar109 >> 1) & 1);
  auVar146._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar116._4_4_;
  bVar16 = (bool)((byte)(uVar109 >> 2) & 1);
  auVar146._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar116._8_4_;
  bVar16 = (bool)((byte)(uVar109 >> 3) & 1);
  auVar146._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar116._12_4_;
  auVar146._16_4_ = (uint)((byte)(uVar109 >> 4) & 1) * 0x219392ef;
  auVar146._20_4_ = (uint)((byte)(uVar109 >> 5) & 1) * 0x219392ef;
  auVar146._24_4_ = (uint)((byte)(uVar109 >> 6) & 1) * 0x219392ef;
  auVar146._28_4_ = (uint)(byte)(uVar109 >> 7) * 0x219392ef;
  auVar126 = vandps_avx(ZEXT1632(auVar117),auVar218);
  uVar109 = vcmpps_avx512vl(auVar126,auVar214,1);
  bVar16 = (bool)((byte)uVar109 & 1);
  auVar126._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar117._0_4_;
  bVar16 = (bool)((byte)(uVar109 >> 1) & 1);
  auVar126._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar117._4_4_;
  bVar16 = (bool)((byte)(uVar109 >> 2) & 1);
  auVar126._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar117._8_4_;
  bVar16 = (bool)((byte)(uVar109 >> 3) & 1);
  auVar126._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar117._12_4_;
  auVar126._16_4_ = (uint)((byte)(uVar109 >> 4) & 1) * 0x219392ef;
  auVar126._20_4_ = (uint)((byte)(uVar109 >> 5) & 1) * 0x219392ef;
  auVar126._24_4_ = (uint)((byte)(uVar109 >> 6) & 1) * 0x219392ef;
  auVar126._28_4_ = (uint)(byte)(uVar109 >> 7) * 0x219392ef;
  auVar124 = vrcp14ps_avx512vl(auVar122);
  auVar215._8_4_ = 0x3f800000;
  auVar215._0_8_ = &DAT_3f8000003f800000;
  auVar215._12_4_ = 0x3f800000;
  auVar215._16_4_ = 0x3f800000;
  auVar215._20_4_ = 0x3f800000;
  auVar215._24_4_ = 0x3f800000;
  auVar215._28_4_ = 0x3f800000;
  auVar30 = vfnmadd213ps_fma(auVar122,auVar124,auVar215);
  auVar30 = vfmadd132ps_fma(ZEXT1632(auVar30),auVar124,auVar124);
  auVar124 = vrcp14ps_avx512vl(auVar146);
  auVar116 = vfnmadd213ps_fma(auVar146,auVar124,auVar215);
  auVar116 = vfmadd132ps_fma(ZEXT1632(auVar116),auVar124,auVar124);
  auVar124 = vrcp14ps_avx512vl(auVar126);
  auVar117 = vfnmadd213ps_fma(auVar126,auVar124,auVar215);
  auVar117 = vfmadd132ps_fma(ZEXT1632(auVar117),auVar124,auVar124);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 7 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar115));
  auVar133._4_4_ = auVar30._4_4_ * auVar126._4_4_;
  auVar133._0_4_ = auVar30._0_4_ * auVar126._0_4_;
  auVar133._8_4_ = auVar30._8_4_ * auVar126._8_4_;
  auVar133._12_4_ = auVar30._12_4_ * auVar126._12_4_;
  auVar133._16_4_ = auVar126._16_4_ * 0.0;
  auVar133._20_4_ = auVar126._20_4_ * 0.0;
  auVar133._24_4_ = auVar126._24_4_ * 0.0;
  auVar133._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 9 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar115));
  auVar125 = vpbroadcastd_avx512vl();
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar11 * 0x10 + 6));
  auVar149._0_4_ = auVar30._0_4_ * auVar126._0_4_;
  auVar149._4_4_ = auVar30._4_4_ * auVar126._4_4_;
  auVar149._8_4_ = auVar30._8_4_ * auVar126._8_4_;
  auVar149._12_4_ = auVar30._12_4_ * auVar126._12_4_;
  auVar149._16_4_ = auVar126._16_4_ * 0.0;
  auVar149._20_4_ = auVar126._20_4_ * 0.0;
  auVar149._24_4_ = auVar126._24_4_ * 0.0;
  auVar149._28_4_ = 0;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar11 * 0x10 + uVar105 * -2 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar6));
  auVar128._4_4_ = auVar116._4_4_ * auVar126._4_4_;
  auVar128._0_4_ = auVar116._0_4_ * auVar126._0_4_;
  auVar128._8_4_ = auVar116._8_4_ * auVar126._8_4_;
  auVar128._12_4_ = auVar116._12_4_ * auVar126._12_4_;
  auVar128._16_4_ = auVar126._16_4_ * 0.0;
  auVar128._20_4_ = auVar126._20_4_ * 0.0;
  auVar128._24_4_ = auVar126._24_4_ * 0.0;
  auVar128._28_4_ = auVar126._28_4_;
  auVar126 = vcvtdq2ps_avx(auVar124);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar6));
  auVar148._0_4_ = auVar116._0_4_ * auVar126._0_4_;
  auVar148._4_4_ = auVar116._4_4_ * auVar126._4_4_;
  auVar148._8_4_ = auVar116._8_4_ * auVar126._8_4_;
  auVar148._12_4_ = auVar116._12_4_ * auVar126._12_4_;
  auVar148._16_4_ = auVar126._16_4_ * 0.0;
  auVar148._20_4_ = auVar126._20_4_ * 0.0;
  auVar148._24_4_ = auVar126._24_4_ * 0.0;
  auVar148._28_4_ = 0;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar101 + uVar105 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar7));
  auVar129._4_4_ = auVar126._4_4_ * auVar117._4_4_;
  auVar129._0_4_ = auVar126._0_4_ * auVar117._0_4_;
  auVar129._8_4_ = auVar126._8_4_ * auVar117._8_4_;
  auVar129._12_4_ = auVar126._12_4_ * auVar117._12_4_;
  auVar129._16_4_ = auVar126._16_4_ * 0.0;
  auVar129._20_4_ = auVar126._20_4_ * 0.0;
  auVar129._24_4_ = auVar126._24_4_ * 0.0;
  auVar129._28_4_ = auVar126._28_4_;
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 0x17 + 6));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,ZEXT1632(auVar7));
  auVar147._0_4_ = auVar117._0_4_ * auVar126._0_4_;
  auVar147._4_4_ = auVar117._4_4_ * auVar126._4_4_;
  auVar147._8_4_ = auVar117._8_4_ * auVar126._8_4_;
  auVar147._12_4_ = auVar117._12_4_ * auVar126._12_4_;
  auVar147._16_4_ = auVar126._16_4_ * 0.0;
  auVar147._20_4_ = auVar126._20_4_ * 0.0;
  auVar147._24_4_ = auVar126._24_4_ * 0.0;
  auVar147._28_4_ = 0;
  auVar126 = vpminsd_avx2(auVar133,auVar149);
  auVar124 = vpminsd_avx2(auVar128,auVar148);
  auVar126 = vmaxps_avx(auVar126,auVar124);
  auVar124 = vpminsd_avx2(auVar129,auVar147);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar135._4_4_ = uVar171;
  auVar135._0_4_ = uVar171;
  auVar135._8_4_ = uVar171;
  auVar135._12_4_ = uVar171;
  auVar135._16_4_ = uVar171;
  auVar135._20_4_ = uVar171;
  auVar135._24_4_ = uVar171;
  auVar135._28_4_ = uVar171;
  auVar124 = vmaxps_avx512vl(auVar124,auVar135);
  auVar126 = vmaxps_avx(auVar126,auVar124);
  auVar124._8_4_ = 0x3f7ffffa;
  auVar124._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar124._12_4_ = 0x3f7ffffa;
  auVar124._16_4_ = 0x3f7ffffa;
  auVar124._20_4_ = 0x3f7ffffa;
  auVar124._24_4_ = 0x3f7ffffa;
  auVar124._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar126,auVar124);
  auVar126 = vpmaxsd_avx2(auVar133,auVar149);
  auVar124 = vpmaxsd_avx2(auVar128,auVar148);
  auVar126 = vminps_avx(auVar126,auVar124);
  auVar124 = vpmaxsd_avx2(auVar129,auVar147);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar134._4_4_ = uVar171;
  auVar134._0_4_ = uVar171;
  auVar134._8_4_ = uVar171;
  auVar134._12_4_ = uVar171;
  auVar134._16_4_ = uVar171;
  auVar134._20_4_ = uVar171;
  auVar134._24_4_ = uVar171;
  auVar134._28_4_ = uVar171;
  auVar124 = vminps_avx512vl(auVar124,auVar134);
  auVar126 = vminps_avx(auVar126,auVar124);
  auVar127._8_4_ = 0x3f800003;
  auVar127._0_8_ = 0x3f8000033f800003;
  auVar127._12_4_ = 0x3f800003;
  auVar127._16_4_ = 0x3f800003;
  auVar127._20_4_ = 0x3f800003;
  auVar127._24_4_ = 0x3f800003;
  auVar127._28_4_ = 0x3f800003;
  auVar126 = vmulps_avx512vl(auVar126,auVar127);
  uVar31 = vpcmpgtd_avx512vl(auVar125,_DAT_0205a920);
  uVar172 = vcmpps_avx512vl(local_320,auVar126,2);
  if ((byte)((byte)uVar172 & (byte)uVar31) != 0) {
    uVar109 = (ulong)(byte)((byte)uVar172 & (byte)uVar31);
    local_7e8 = pre->ray_space + k;
    local_958 = (undefined1 (*) [32])local_100;
    auVar184 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar184);
    do {
      lVar108 = 0;
      for (uVar101 = uVar109; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x8000000000000000) {
        lVar108 = lVar108 + 1;
      }
      uVar111 = *(uint *)(prim + 2);
      uVar12 = *(uint *)(prim + lVar108 * 4 + 6);
      pGVar110 = (context->scene->geometries).items[uVar111].ptr;
      uVar101 = (ulong)*(uint *)(*(long *)&pGVar110->field_0x58 +
                                (ulong)uVar12 *
                                pGVar110[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      lVar102 = (long)pGVar110[1].intersectionFilterN * uVar101;
      lVar108 = *(long *)&pGVar110[1].time_range.upper;
      auVar30 = *(undefined1 (*) [16])(lVar108 + lVar102);
      lVar106 = (long)pGVar110[1].intersectionFilterN * (uVar101 + 1);
      _local_940 = *(undefined1 (*) [16])(lVar108 + lVar106);
      iVar13 = (int)pGVar110[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar116 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar116 = vinsertps_avx(auVar116,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      lVar79 = (long)iVar13 * 0x44;
      auVar186._8_4_ = 0xbeaaaaab;
      auVar186._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar186._12_4_ = 0xbeaaaaab;
      local_930 = vfnmadd132ps_avx512vl
                            (*(undefined1 (*) [16])
                              (pGVar110[2].intersectionFilterN +
                              uVar101 * (long)pGVar110[2].pointQueryFunc),auVar30,auVar186);
      local_950 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar110[2].intersectionFilterN +
                                   (long)pGVar110[2].pointQueryFunc * (uVar101 + 1)),_local_940,
                                  auVar186);
      auVar115 = vsubps_avx(auVar30,auVar116);
      uVar171 = auVar115._0_4_;
      auVar118._4_4_ = uVar171;
      auVar118._0_4_ = uVar171;
      auVar118._8_4_ = uVar171;
      auVar118._12_4_ = uVar171;
      auVar117 = vshufps_avx(auVar115,auVar115,0x55);
      aVar4 = (local_7e8->vx).field_0;
      aVar5 = (local_7e8->vy).field_0;
      fVar203 = (local_7e8->vz).field_0.m128[0];
      fVar170 = *(float *)((long)&(local_7e8->vz).field_0 + 4);
      fVar208 = *(float *)((long)&(local_7e8->vz).field_0 + 8);
      fVar209 = *(float *)((long)&(local_7e8->vz).field_0 + 0xc);
      auVar115 = vshufps_avx(auVar115,auVar115,0xaa);
      auVar120._0_4_ = fVar203 * auVar115._0_4_;
      auVar120._4_4_ = fVar170 * auVar115._4_4_;
      auVar120._8_4_ = fVar208 * auVar115._8_4_;
      auVar120._12_4_ = fVar209 * auVar115._12_4_;
      auVar117 = vfmadd231ps_fma(auVar120,(undefined1  [16])aVar5,auVar117);
      auVar6 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar4,auVar118);
      auVar115 = vsubps_avx512vl(local_930,auVar116);
      uVar171 = auVar115._0_4_;
      auVar119._4_4_ = uVar171;
      auVar119._0_4_ = uVar171;
      auVar119._8_4_ = uVar171;
      auVar119._12_4_ = uVar171;
      auVar117 = vshufps_avx(auVar115,auVar115,0x55);
      auVar115 = vshufps_avx(auVar115,auVar115,0xaa);
      auVar223._0_4_ = fVar203 * auVar115._0_4_;
      auVar223._4_4_ = fVar170 * auVar115._4_4_;
      auVar223._8_4_ = fVar208 * auVar115._8_4_;
      auVar223._12_4_ = fVar209 * auVar115._12_4_;
      auVar117 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar5,auVar117);
      auVar7 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar4,auVar119);
      auVar115 = vsubps_avx(local_950,auVar116);
      uVar171 = auVar115._0_4_;
      auVar187._4_4_ = uVar171;
      auVar187._0_4_ = uVar171;
      auVar187._8_4_ = uVar171;
      auVar187._12_4_ = uVar171;
      auVar117 = vshufps_avx(auVar115,auVar115,0x55);
      auVar115 = vshufps_avx(auVar115,auVar115,0xaa);
      auVar224._0_4_ = fVar203 * auVar115._0_4_;
      auVar224._4_4_ = fVar170 * auVar115._4_4_;
      auVar224._8_4_ = fVar208 * auVar115._8_4_;
      auVar224._12_4_ = fVar209 * auVar115._12_4_;
      auVar117 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar5,auVar117);
      auVar115 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar4,auVar187);
      auVar117 = vsubps_avx(_local_940,auVar116);
      uVar171 = auVar117._0_4_;
      auVar185._4_4_ = uVar171;
      auVar185._0_4_ = uVar171;
      auVar185._8_4_ = uVar171;
      auVar185._12_4_ = uVar171;
      auVar116 = vshufps_avx(auVar117,auVar117,0x55);
      auVar117 = vshufps_avx(auVar117,auVar117,0xaa);
      auVar227._0_4_ = fVar203 * auVar117._0_4_;
      auVar227._4_4_ = fVar170 * auVar117._4_4_;
      auVar227._8_4_ = fVar208 * auVar117._8_4_;
      auVar227._12_4_ = fVar209 * auVar117._12_4_;
      auVar116 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar5,auVar116);
      auVar8 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar4,auVar185);
      auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar79);
      uVar171 = auVar6._0_4_;
      local_760._4_4_ = uVar171;
      local_760._0_4_ = uVar171;
      local_760._8_4_ = uVar171;
      local_760._12_4_ = uVar171;
      local_760._16_4_ = uVar171;
      local_760._20_4_ = uVar171;
      local_760._24_4_ = uVar171;
      local_760._28_4_ = uVar171;
      auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x484);
      auVar177._8_4_ = 1;
      auVar177._0_8_ = 0x100000001;
      auVar177._12_4_ = 1;
      auVar177._16_4_ = 1;
      auVar177._20_4_ = 1;
      auVar177._24_4_ = 1;
      auVar177._28_4_ = 1;
      local_780 = vpermps_avx2(auVar177,ZEXT1632(auVar6));
      local_7a0 = vbroadcastss_avx512vl(auVar7);
      local_7c0 = vpermps_avx512vl(auVar177,ZEXT1632(auVar7));
      auVar135 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x908);
      local_840 = vbroadcastss_avx512vl(auVar115);
      auVar184 = ZEXT3264(local_840);
      local_860 = vpermps_avx512vl(auVar177,ZEXT1632(auVar115));
      auVar236 = ZEXT3264(local_860);
      auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0xd8c);
      local_880 = vbroadcastss_avx512vl(auVar8);
      auVar234 = ZEXT3264(local_880);
      local_8a0 = vpermps_avx512vl(auVar177,ZEXT1632(auVar8));
      auVar235 = ZEXT3264(local_8a0);
      auVar127 = vmulps_avx512vl(local_880,auVar134);
      auVar125 = vmulps_avx512vl(local_8a0,auVar134);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar135,local_840);
      auVar125 = vfmadd231ps_avx512vl(auVar125,auVar135,local_860);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar124,local_7a0);
      auVar128 = vfmadd231ps_avx512vl(auVar125,auVar124,local_7c0);
      auVar9 = vfmadd231ps_fma(auVar127,auVar126,local_760);
      auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar79);
      auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x484);
      auVar133 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x908);
      auVar10 = vfmadd231ps_fma(auVar128,auVar126,local_780);
      auVar128 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0xd8c);
      auVar129 = vmulps_avx512vl(local_880,auVar128);
      auVar130 = vmulps_avx512vl(local_8a0,auVar128);
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar133,local_840);
      auVar130 = vfmadd231ps_avx512vl(auVar130,auVar133,local_860);
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar125,local_7a0);
      auVar130 = vfmadd231ps_avx512vl(auVar130,auVar125,local_7c0);
      auVar185 = vfmadd231ps_fma(auVar129,auVar127,local_760);
      auVar186 = vfmadd231ps_fma(auVar130,auVar127,local_780);
      auVar129 = vsubps_avx512vl(ZEXT1632(auVar185),ZEXT1632(auVar9));
      auVar130 = vsubps_avx512vl(ZEXT1632(auVar186),ZEXT1632(auVar10));
      auVar123 = vmulps_avx512vl(ZEXT1632(auVar10),auVar129);
      auVar131 = vmulps_avx512vl(ZEXT1632(auVar9),auVar130);
      auVar123 = vsubps_avx512vl(auVar123,auVar131);
      auVar116 = vshufps_avx512vl(local_930,local_930,0xff);
      uVar172 = auVar116._0_8_;
      local_340._8_8_ = uVar172;
      local_340._0_8_ = uVar172;
      local_340._16_8_ = uVar172;
      local_340._24_8_ = uVar172;
      auVar116 = vshufps_avx(local_950,local_950,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar116);
      _local_380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar108 + 0xc + lVar106)));
      auVar131 = vmulps_avx512vl(_local_380,auVar134);
      auVar131 = vfmadd231ps_avx512vl(auVar131,auVar135,local_360);
      auVar116 = vfmadd231ps_fma(auVar131,auVar124,local_340);
      local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar108 + 0xc + lVar102)));
      auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar116),auVar126,local_3a0);
      auVar132 = vmulps_avx512vl(_local_380,auVar128);
      auVar132 = vfmadd231ps_avx512vl(auVar132,auVar133,local_360);
      auVar132 = vfmadd231ps_avx512vl(auVar132,auVar125,local_340);
      auVar132 = vfmadd231ps_avx512vl(auVar132,auVar127,local_3a0);
      auVar121 = vmulps_avx512vl(auVar130,auVar130);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar129,auVar129);
      auVar122 = vmaxps_avx512vl(auVar131,auVar132);
      auVar122 = vmulps_avx512vl(auVar122,auVar122);
      auVar121 = vmulps_avx512vl(auVar122,auVar121);
      auVar123 = vmulps_avx512vl(auVar123,auVar123);
      uVar172 = vcmpps_avx512vl(auVar123,auVar121,2);
      auVar116 = vinsertps_avx512f(auVar6,local_3a0._0_16_,0x30);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar118 = vandps_avx512vl(auVar116,auVar117);
      auVar116 = vblendps_avx(auVar7,local_930,8);
      auVar116 = vandps_avx512vl(auVar116,auVar117);
      auVar118 = vmaxps_avx512vl(auVar118,auVar116);
      auVar116 = vblendps_avx(auVar115,local_950,8);
      auVar119 = vandps_avx512vl(auVar116,auVar117);
      auVar116 = vinsertps_avx512f(auVar8,local_380._0_16_,0x30);
      auVar116 = vandps_avx512vl(auVar116,auVar117);
      auVar116 = vmaxps_avx512vl(auVar119,auVar116);
      auVar116 = vmaxps_avx(auVar118,auVar116);
      auVar117 = vmovshdup_avx(auVar116);
      auVar117 = vmaxss_avx(auVar117,auVar116);
      auVar116 = vshufpd_avx(auVar116,auVar116,1);
      auVar116 = vmaxss_avx(auVar116,auVar117);
      auVar117 = vpxord_avx512vl(local_930,local_930);
      _local_740 = vcvtsi2ss_avx512f(auVar117,iVar13);
      auVar221._0_4_ = local_740._0_4_;
      auVar221._4_4_ = auVar221._0_4_;
      auVar221._8_4_ = auVar221._0_4_;
      auVar221._12_4_ = auVar221._0_4_;
      auVar221._16_4_ = auVar221._0_4_;
      auVar221._20_4_ = auVar221._0_4_;
      auVar221._24_4_ = auVar221._0_4_;
      auVar221._28_4_ = auVar221._0_4_;
      uVar31 = vcmpps_avx512vl(auVar221,_DAT_02020f40,0xe);
      bVar112 = (byte)uVar172 & (byte)uVar31;
      auVar116 = vmulss_avx512f(auVar116,ZEXT416(0x35000000));
      auVar220._8_4_ = 2;
      auVar220._0_8_ = 0x200000002;
      auVar220._12_4_ = 2;
      auVar220._16_4_ = 2;
      auVar220._20_4_ = 2;
      auVar220._24_4_ = 2;
      auVar220._28_4_ = 2;
      local_520 = vpermps_avx2(auVar220,ZEXT1632(auVar6));
      local_540 = vpermps_avx2(auVar220,ZEXT1632(auVar7));
      local_3c0 = vpermps_avx512vl(auVar220,ZEXT1632(auVar115));
      local_3e0 = vpermps_avx512vl(auVar220,ZEXT1632(auVar8));
      uVar171 = *(undefined4 *)(ray + k * 4 + 0xc0);
      local_5a0 = auVar116._0_4_;
      uStack_59c = auVar116._4_4_;
      uStack_598 = auVar116._8_4_;
      uStack_594 = auVar116._12_4_;
      local_9a0 = auVar30._0_8_;
      uStack_998 = auVar30._8_8_;
      if (bVar112 == 0) {
        auVar116 = vxorps_avx512vl(auVar128._0_16_,auVar128._0_16_);
        auVar230 = ZEXT1664(auVar116);
        auVar231 = ZEXT3264(local_760);
        auVar232 = ZEXT3264(local_780);
        auVar233 = ZEXT3264(local_7a0);
        auVar237 = ZEXT3264(local_7c0);
      }
      else {
        uStack_7dc = 0;
        uStack_7d8 = 0;
        uStack_7d4 = 0;
        auVar128 = vmulps_avx512vl(local_3e0,auVar128);
        auVar133 = vfmadd213ps_avx512vl(auVar133,local_3c0,auVar128);
        auVar125 = vfmadd213ps_avx512vl(auVar125,local_540,auVar133);
        auVar125 = vfmadd213ps_avx512vl(auVar127,local_520,auVar125);
        auVar134 = vmulps_avx512vl(local_3e0,auVar134);
        auVar135 = vfmadd213ps_avx512vl(auVar135,local_3c0,auVar134);
        auVar133 = vfmadd213ps_avx512vl(auVar124,local_540,auVar135);
        auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1210);
        auVar135 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1694);
        auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1b18);
        auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1f9c);
        auVar133 = vfmadd213ps_avx512vl(auVar126,local_520,auVar133);
        auVar126 = vmulps_avx512vl(local_880,auVar127);
        auVar128 = vmulps_avx512vl(local_8a0,auVar127);
        auVar127 = vmulps_avx512vl(local_3e0,auVar127);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar134,local_840);
        auVar128 = vfmadd231ps_avx512vl(auVar128,auVar134,local_860);
        auVar134 = vfmadd231ps_avx512vl(auVar127,local_3c0,auVar134);
        auVar117 = vfmadd231ps_fma(auVar126,auVar135,local_7a0);
        auVar237 = ZEXT3264(local_7c0);
        auVar126 = vfmadd231ps_avx512vl(auVar128,auVar135,local_7c0);
        auVar127 = vfmadd231ps_avx512vl(auVar134,local_540,auVar135);
        auVar128 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),auVar124,local_760);
        auVar123 = vfmadd231ps_avx512vl(auVar126,auVar124,local_780);
        auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1210);
        auVar135 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1b18);
        auVar134 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1f9c);
        auVar127 = vfmadd231ps_avx512vl(auVar127,local_520,auVar124);
        auVar124 = vmulps_avx512vl(local_880,auVar134);
        auVar121 = vmulps_avx512vl(local_8a0,auVar134);
        auVar134 = vmulps_avx512vl(local_3e0,auVar134);
        auVar122 = vfmadd231ps_avx512vl(auVar124,auVar135,local_840);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar135,local_860);
        auVar135 = vfmadd231ps_avx512vl(auVar134,local_3c0,auVar135);
        auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1694);
        auVar134 = vfmadd231ps_avx512vl(auVar122,auVar124,local_7a0);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar124,local_7c0);
        auVar124 = vfmadd231ps_avx512vl(auVar135,local_540,auVar124);
        auVar135 = vfmadd231ps_avx512vl(auVar134,auVar126,local_760);
        auVar134 = vfmadd231ps_avx512vl(auVar121,auVar126,local_780);
        auVar124 = vfmadd231ps_avx512vl(auVar124,local_520,auVar126);
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar128,auVar121);
        vandps_avx512vl(auVar123,auVar121);
        auVar126 = vmaxps_avx(auVar121,auVar121);
        vandps_avx512vl(auVar127,auVar121);
        auVar126 = vmaxps_avx(auVar126,auVar121);
        auVar127 = vbroadcastss_avx512vl(auVar116);
        uVar101 = vcmpps_avx512vl(auVar126,auVar127,1);
        bVar16 = (bool)((byte)uVar101 & 1);
        auVar136._0_4_ = (float)((uint)bVar16 * auVar129._0_4_ | (uint)!bVar16 * auVar128._0_4_);
        bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
        auVar136._4_4_ = (float)((uint)bVar16 * auVar129._4_4_ | (uint)!bVar16 * auVar128._4_4_);
        bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
        auVar136._8_4_ = (float)((uint)bVar16 * auVar129._8_4_ | (uint)!bVar16 * auVar128._8_4_);
        bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar136._12_4_ = (float)((uint)bVar16 * auVar129._12_4_ | (uint)!bVar16 * auVar128._12_4_);
        bVar16 = (bool)((byte)(uVar101 >> 4) & 1);
        auVar136._16_4_ = (float)((uint)bVar16 * auVar129._16_4_ | (uint)!bVar16 * auVar128._16_4_);
        bVar16 = (bool)((byte)(uVar101 >> 5) & 1);
        auVar136._20_4_ = (float)((uint)bVar16 * auVar129._20_4_ | (uint)!bVar16 * auVar128._20_4_);
        bVar16 = (bool)((byte)(uVar101 >> 6) & 1);
        auVar136._24_4_ = (float)((uint)bVar16 * auVar129._24_4_ | (uint)!bVar16 * auVar128._24_4_);
        bVar16 = SUB81(uVar101 >> 7,0);
        auVar136._28_4_ = (uint)bVar16 * auVar129._28_4_ | (uint)!bVar16 * auVar128._28_4_;
        bVar16 = (bool)((byte)uVar101 & 1);
        auVar137._0_4_ = (float)((uint)bVar16 * auVar130._0_4_ | (uint)!bVar16 * auVar123._0_4_);
        bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
        auVar137._4_4_ = (float)((uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * auVar123._4_4_);
        bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
        auVar137._8_4_ = (float)((uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * auVar123._8_4_);
        bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar137._12_4_ = (float)((uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * auVar123._12_4_);
        bVar16 = (bool)((byte)(uVar101 >> 4) & 1);
        auVar137._16_4_ = (float)((uint)bVar16 * auVar130._16_4_ | (uint)!bVar16 * auVar123._16_4_);
        bVar16 = (bool)((byte)(uVar101 >> 5) & 1);
        auVar137._20_4_ = (float)((uint)bVar16 * auVar130._20_4_ | (uint)!bVar16 * auVar123._20_4_);
        bVar16 = (bool)((byte)(uVar101 >> 6) & 1);
        auVar137._24_4_ = (float)((uint)bVar16 * auVar130._24_4_ | (uint)!bVar16 * auVar123._24_4_);
        bVar16 = SUB81(uVar101 >> 7,0);
        auVar137._28_4_ = (uint)bVar16 * auVar130._28_4_ | (uint)!bVar16 * auVar123._28_4_;
        vandps_avx512vl(auVar135,auVar121);
        vandps_avx512vl(auVar134,auVar121);
        auVar126 = vmaxps_avx(auVar137,auVar137);
        vandps_avx512vl(auVar124,auVar121);
        auVar126 = vmaxps_avx(auVar126,auVar137);
        uVar101 = vcmpps_avx512vl(auVar126,auVar127,1);
        bVar16 = (bool)((byte)uVar101 & 1);
        auVar138._0_4_ = (float)((uint)bVar16 * auVar129._0_4_ | (uint)!bVar16 * auVar135._0_4_);
        bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
        auVar138._4_4_ = (float)((uint)bVar16 * auVar129._4_4_ | (uint)!bVar16 * auVar135._4_4_);
        bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
        auVar138._8_4_ = (float)((uint)bVar16 * auVar129._8_4_ | (uint)!bVar16 * auVar135._8_4_);
        bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar138._12_4_ = (float)((uint)bVar16 * auVar129._12_4_ | (uint)!bVar16 * auVar135._12_4_);
        bVar16 = (bool)((byte)(uVar101 >> 4) & 1);
        auVar138._16_4_ = (float)((uint)bVar16 * auVar129._16_4_ | (uint)!bVar16 * auVar135._16_4_);
        bVar16 = (bool)((byte)(uVar101 >> 5) & 1);
        auVar138._20_4_ = (float)((uint)bVar16 * auVar129._20_4_ | (uint)!bVar16 * auVar135._20_4_);
        bVar16 = (bool)((byte)(uVar101 >> 6) & 1);
        auVar138._24_4_ = (float)((uint)bVar16 * auVar129._24_4_ | (uint)!bVar16 * auVar135._24_4_);
        bVar16 = SUB81(uVar101 >> 7,0);
        auVar138._28_4_ = (uint)bVar16 * auVar129._28_4_ | (uint)!bVar16 * auVar135._28_4_;
        bVar16 = (bool)((byte)uVar101 & 1);
        auVar139._0_4_ = (float)((uint)bVar16 * auVar130._0_4_ | (uint)!bVar16 * auVar134._0_4_);
        bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
        auVar139._4_4_ = (float)((uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * auVar134._4_4_);
        bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
        auVar139._8_4_ = (float)((uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * auVar134._8_4_);
        bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar139._12_4_ = (float)((uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * auVar134._12_4_);
        bVar16 = (bool)((byte)(uVar101 >> 4) & 1);
        auVar139._16_4_ = (float)((uint)bVar16 * auVar130._16_4_ | (uint)!bVar16 * auVar134._16_4_);
        bVar16 = (bool)((byte)(uVar101 >> 5) & 1);
        auVar139._20_4_ = (float)((uint)bVar16 * auVar130._20_4_ | (uint)!bVar16 * auVar134._20_4_);
        bVar16 = (bool)((byte)(uVar101 >> 6) & 1);
        auVar139._24_4_ = (float)((uint)bVar16 * auVar130._24_4_ | (uint)!bVar16 * auVar134._24_4_);
        bVar16 = SUB81(uVar101 >> 7,0);
        auVar139._28_4_ = (uint)bVar16 * auVar130._28_4_ | (uint)!bVar16 * auVar134._28_4_;
        auVar120 = vxorps_avx512vl(local_520._0_16_,local_520._0_16_);
        auVar230 = ZEXT1664(auVar120);
        auVar126 = vfmadd213ps_avx512vl(auVar136,auVar136,ZEXT1632(auVar120));
        auVar116 = vfmadd231ps_fma(auVar126,auVar137,auVar137);
        auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar116));
        auVar135 = vbroadcastss_avx512vl(ZEXT416(0xbf000000));
        auVar134 = vmulps_avx512vl(ZEXT1632(auVar116),auVar135);
        fVar203 = auVar126._0_4_;
        fVar170 = auVar126._4_4_;
        fVar208 = auVar126._8_4_;
        fVar209 = auVar126._12_4_;
        fVar193 = auVar126._16_4_;
        fVar200 = auVar126._20_4_;
        fVar201 = auVar126._24_4_;
        auVar43._4_4_ = fVar170 * fVar170 * fVar170 * auVar134._4_4_;
        auVar43._0_4_ = fVar203 * fVar203 * fVar203 * auVar134._0_4_;
        auVar43._8_4_ = fVar208 * fVar208 * fVar208 * auVar134._8_4_;
        auVar43._12_4_ = fVar209 * fVar209 * fVar209 * auVar134._12_4_;
        auVar43._16_4_ = fVar193 * fVar193 * fVar193 * auVar134._16_4_;
        auVar43._20_4_ = fVar200 * fVar200 * fVar200 * auVar134._20_4_;
        auVar43._24_4_ = fVar201 * fVar201 * fVar201 * auVar134._24_4_;
        auVar43._28_4_ = auVar124._28_4_;
        auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar126 = vfmadd231ps_avx512vl(auVar43,auVar124,auVar126);
        auVar44._4_4_ = auVar137._4_4_ * auVar126._4_4_;
        auVar44._0_4_ = auVar137._0_4_ * auVar126._0_4_;
        auVar44._8_4_ = auVar137._8_4_ * auVar126._8_4_;
        auVar44._12_4_ = auVar137._12_4_ * auVar126._12_4_;
        auVar44._16_4_ = auVar137._16_4_ * auVar126._16_4_;
        auVar44._20_4_ = auVar137._20_4_ * auVar126._20_4_;
        auVar44._24_4_ = auVar137._24_4_ * auVar126._24_4_;
        auVar44._28_4_ = auVar134._28_4_;
        auVar45._4_4_ = auVar126._4_4_ * -auVar136._4_4_;
        auVar45._0_4_ = auVar126._0_4_ * -auVar136._0_4_;
        auVar45._8_4_ = auVar126._8_4_ * -auVar136._8_4_;
        auVar45._12_4_ = auVar126._12_4_ * -auVar136._12_4_;
        auVar45._16_4_ = auVar126._16_4_ * -auVar136._16_4_;
        auVar45._20_4_ = auVar126._20_4_ * -auVar136._20_4_;
        auVar45._24_4_ = auVar126._24_4_ * -auVar136._24_4_;
        auVar45._28_4_ = auVar137._28_4_;
        auVar134 = vmulps_avx512vl(auVar126,ZEXT1632(auVar120));
        auVar128 = ZEXT1632(auVar120);
        auVar127 = vfmadd213ps_avx512vl(auVar138,auVar138,auVar128);
        auVar116 = vfmadd231ps_fma(auVar127,auVar139,auVar139);
        auVar127 = vrsqrt14ps_avx512vl(ZEXT1632(auVar116));
        auVar135 = vmulps_avx512vl(ZEXT1632(auVar116),auVar135);
        fVar203 = auVar127._0_4_;
        fVar170 = auVar127._4_4_;
        fVar208 = auVar127._8_4_;
        fVar209 = auVar127._12_4_;
        fVar193 = auVar127._16_4_;
        fVar200 = auVar127._20_4_;
        fVar201 = auVar127._24_4_;
        auVar46._4_4_ = fVar170 * fVar170 * fVar170 * auVar135._4_4_;
        auVar46._0_4_ = fVar203 * fVar203 * fVar203 * auVar135._0_4_;
        auVar46._8_4_ = fVar208 * fVar208 * fVar208 * auVar135._8_4_;
        auVar46._12_4_ = fVar209 * fVar209 * fVar209 * auVar135._12_4_;
        auVar46._16_4_ = fVar193 * fVar193 * fVar193 * auVar135._16_4_;
        auVar46._20_4_ = fVar200 * fVar200 * fVar200 * auVar135._20_4_;
        auVar46._24_4_ = fVar201 * fVar201 * fVar201 * auVar135._24_4_;
        auVar46._28_4_ = auVar126._28_4_;
        auVar126 = vfmadd231ps_avx512vl(auVar46,auVar124,auVar127);
        auVar47._4_4_ = auVar139._4_4_ * auVar126._4_4_;
        auVar47._0_4_ = auVar139._0_4_ * auVar126._0_4_;
        auVar47._8_4_ = auVar139._8_4_ * auVar126._8_4_;
        auVar47._12_4_ = auVar139._12_4_ * auVar126._12_4_;
        auVar47._16_4_ = auVar139._16_4_ * auVar126._16_4_;
        auVar47._20_4_ = auVar139._20_4_ * auVar126._20_4_;
        auVar47._24_4_ = auVar139._24_4_ * auVar126._24_4_;
        auVar47._28_4_ = auVar135._28_4_;
        auVar48._4_4_ = auVar126._4_4_ * -auVar138._4_4_;
        auVar48._0_4_ = auVar126._0_4_ * -auVar138._0_4_;
        auVar48._8_4_ = auVar126._8_4_ * -auVar138._8_4_;
        auVar48._12_4_ = auVar126._12_4_ * -auVar138._12_4_;
        auVar48._16_4_ = auVar126._16_4_ * -auVar138._16_4_;
        auVar48._20_4_ = auVar126._20_4_ * -auVar138._20_4_;
        auVar48._24_4_ = auVar126._24_4_ * -auVar138._24_4_;
        auVar48._28_4_ = auVar127._28_4_;
        auVar126 = vmulps_avx512vl(auVar126,auVar128);
        auVar116 = vfmadd213ps_fma(auVar44,auVar131,ZEXT1632(auVar9));
        auVar117 = vfmadd213ps_fma(auVar45,auVar131,ZEXT1632(auVar10));
        auVar135 = vfmadd213ps_avx512vl(auVar134,auVar131,auVar133);
        auVar127 = vfmadd213ps_avx512vl(auVar47,auVar132,ZEXT1632(auVar185));
        auVar118 = vfnmadd213ps_fma(auVar44,auVar131,ZEXT1632(auVar9));
        auVar115 = vfmadd213ps_fma(auVar48,auVar132,ZEXT1632(auVar186));
        auVar10 = vfnmadd213ps_fma(auVar45,auVar131,ZEXT1632(auVar10));
        auVar6 = vfmadd213ps_fma(auVar126,auVar132,auVar125);
        auVar119 = vfnmadd231ps_fma(auVar133,auVar131,auVar134);
        auVar185 = vfnmadd213ps_fma(auVar47,auVar132,ZEXT1632(auVar185));
        auVar186 = vfnmadd213ps_fma(auVar48,auVar132,ZEXT1632(auVar186));
        auVar187 = vfnmadd231ps_fma(auVar125,auVar132,auVar126);
        auVar125 = vsubps_avx512vl(auVar127,ZEXT1632(auVar118));
        auVar126 = vsubps_avx(ZEXT1632(auVar115),ZEXT1632(auVar10));
        auVar124 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar119));
        auVar49._4_4_ = auVar126._4_4_ * auVar119._4_4_;
        auVar49._0_4_ = auVar126._0_4_ * auVar119._0_4_;
        auVar49._8_4_ = auVar126._8_4_ * auVar119._8_4_;
        auVar49._12_4_ = auVar126._12_4_ * auVar119._12_4_;
        auVar49._16_4_ = auVar126._16_4_ * 0.0;
        auVar49._20_4_ = auVar126._20_4_ * 0.0;
        auVar49._24_4_ = auVar126._24_4_ * 0.0;
        auVar49._28_4_ = auVar134._28_4_;
        auVar7 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar10),auVar124);
        auVar50._4_4_ = auVar124._4_4_ * auVar118._4_4_;
        auVar50._0_4_ = auVar124._0_4_ * auVar118._0_4_;
        auVar50._8_4_ = auVar124._8_4_ * auVar118._8_4_;
        auVar50._12_4_ = auVar124._12_4_ * auVar118._12_4_;
        auVar50._16_4_ = auVar124._16_4_ * 0.0;
        auVar50._20_4_ = auVar124._20_4_ * 0.0;
        auVar50._24_4_ = auVar124._24_4_ * 0.0;
        auVar50._28_4_ = auVar124._28_4_;
        auVar8 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar119),auVar125);
        auVar51._4_4_ = auVar10._4_4_ * auVar125._4_4_;
        auVar51._0_4_ = auVar10._0_4_ * auVar125._0_4_;
        auVar51._8_4_ = auVar10._8_4_ * auVar125._8_4_;
        auVar51._12_4_ = auVar10._12_4_ * auVar125._12_4_;
        auVar51._16_4_ = auVar125._16_4_ * 0.0;
        auVar51._20_4_ = auVar125._20_4_ * 0.0;
        auVar51._24_4_ = auVar125._24_4_ * 0.0;
        auVar51._28_4_ = auVar125._28_4_;
        auVar9 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar118),auVar126);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar128,ZEXT1632(auVar8));
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar128,ZEXT1632(auVar7));
        auVar121 = ZEXT1632(auVar120);
        uVar101 = vcmpps_avx512vl(auVar126,auVar121,2);
        bVar100 = (byte)uVar101;
        fVar113 = (float)((uint)(bVar100 & 1) * auVar116._0_4_ |
                         (uint)!(bool)(bVar100 & 1) * auVar185._0_4_);
        bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
        fVar164 = (float)((uint)bVar16 * auVar116._4_4_ | (uint)!bVar16 * auVar185._4_4_);
        bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
        fVar166 = (float)((uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * auVar185._8_4_);
        bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
        fVar168 = (float)((uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * auVar185._12_4_);
        auVar133 = ZEXT1632(CONCAT412(fVar168,CONCAT48(fVar166,CONCAT44(fVar164,fVar113))));
        fVar114 = (float)((uint)(bVar100 & 1) * auVar117._0_4_ |
                         (uint)!(bool)(bVar100 & 1) * auVar186._0_4_);
        bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
        fVar165 = (float)((uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * auVar186._4_4_);
        bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
        fVar167 = (float)((uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * auVar186._8_4_);
        bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
        fVar169 = (float)((uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * auVar186._12_4_);
        auVar128 = ZEXT1632(CONCAT412(fVar169,CONCAT48(fVar167,CONCAT44(fVar165,fVar114))));
        auVar140._0_4_ =
             (float)((uint)(bVar100 & 1) * auVar135._0_4_ |
                    (uint)!(bool)(bVar100 & 1) * auVar187._0_4_);
        bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
        auVar140._4_4_ = (float)((uint)bVar16 * auVar135._4_4_ | (uint)!bVar16 * auVar187._4_4_);
        bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
        auVar140._8_4_ = (float)((uint)bVar16 * auVar135._8_4_ | (uint)!bVar16 * auVar187._8_4_);
        bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar140._12_4_ = (float)((uint)bVar16 * auVar135._12_4_ | (uint)!bVar16 * auVar187._12_4_);
        fVar170 = (float)((uint)((byte)(uVar101 >> 4) & 1) * auVar135._16_4_);
        auVar140._16_4_ = fVar170;
        fVar203 = (float)((uint)((byte)(uVar101 >> 5) & 1) * auVar135._20_4_);
        auVar140._20_4_ = fVar203;
        fVar208 = (float)((uint)((byte)(uVar101 >> 6) & 1) * auVar135._24_4_);
        auVar140._24_4_ = fVar208;
        iVar1 = (uint)(byte)(uVar101 >> 7) * auVar135._28_4_;
        auVar140._28_4_ = iVar1;
        auVar126 = vblendmps_avx512vl(ZEXT1632(auVar118),auVar127);
        auVar141._0_4_ =
             (uint)(bVar100 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar100 & 1) * auVar116._0_4_;
        bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
        auVar141._4_4_ = (uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * auVar116._4_4_;
        bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
        auVar141._8_4_ = (uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * auVar116._8_4_;
        bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar141._12_4_ = (uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * auVar116._12_4_;
        auVar141._16_4_ = (uint)((byte)(uVar101 >> 4) & 1) * auVar126._16_4_;
        auVar141._20_4_ = (uint)((byte)(uVar101 >> 5) & 1) * auVar126._20_4_;
        auVar141._24_4_ = (uint)((byte)(uVar101 >> 6) & 1) * auVar126._24_4_;
        auVar141._28_4_ = (uint)(byte)(uVar101 >> 7) * auVar126._28_4_;
        auVar126 = vblendmps_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar115));
        auVar142._0_4_ =
             (float)((uint)(bVar100 & 1) * auVar126._0_4_ |
                    (uint)!(bool)(bVar100 & 1) * auVar7._0_4_);
        bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
        auVar142._4_4_ = (float)((uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * auVar7._4_4_);
        bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
        auVar142._8_4_ = (float)((uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * auVar7._8_4_);
        bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar142._12_4_ = (float)((uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * auVar7._12_4_);
        fVar209 = (float)((uint)((byte)(uVar101 >> 4) & 1) * auVar126._16_4_);
        auVar142._16_4_ = fVar209;
        fVar193 = (float)((uint)((byte)(uVar101 >> 5) & 1) * auVar126._20_4_);
        auVar142._20_4_ = fVar193;
        fVar200 = (float)((uint)((byte)(uVar101 >> 6) & 1) * auVar126._24_4_);
        auVar142._24_4_ = fVar200;
        auVar142._28_4_ = (uint)(byte)(uVar101 >> 7) * auVar126._28_4_;
        auVar126 = vblendmps_avx512vl(ZEXT1632(auVar119),ZEXT1632(auVar6));
        auVar143._0_4_ =
             (float)((uint)(bVar100 & 1) * auVar126._0_4_ |
                    (uint)!(bool)(bVar100 & 1) * auVar117._0_4_);
        bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
        auVar143._4_4_ = (float)((uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * auVar117._4_4_);
        bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
        auVar143._8_4_ = (float)((uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * auVar117._8_4_);
        bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar143._12_4_ = (float)((uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * auVar117._12_4_);
        fVar192 = (float)((uint)((byte)(uVar101 >> 4) & 1) * auVar126._16_4_);
        auVar143._16_4_ = fVar192;
        fVar202 = (float)((uint)((byte)(uVar101 >> 5) & 1) * auVar126._20_4_);
        auVar143._20_4_ = fVar202;
        fVar201 = (float)((uint)((byte)(uVar101 >> 6) & 1) * auVar126._24_4_);
        auVar143._24_4_ = fVar201;
        iVar2 = (uint)(byte)(uVar101 >> 7) * auVar126._28_4_;
        auVar143._28_4_ = iVar2;
        auVar144._0_4_ =
             (uint)(bVar100 & 1) * (int)auVar118._0_4_ | (uint)!(bool)(bVar100 & 1) * auVar127._0_4_
        ;
        bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
        auVar144._4_4_ = (uint)bVar16 * (int)auVar118._4_4_ | (uint)!bVar16 * auVar127._4_4_;
        bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
        auVar144._8_4_ = (uint)bVar16 * (int)auVar118._8_4_ | (uint)!bVar16 * auVar127._8_4_;
        bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar144._12_4_ = (uint)bVar16 * (int)auVar118._12_4_ | (uint)!bVar16 * auVar127._12_4_;
        auVar144._16_4_ = (uint)!(bool)((byte)(uVar101 >> 4) & 1) * auVar127._16_4_;
        auVar144._20_4_ = (uint)!(bool)((byte)(uVar101 >> 5) & 1) * auVar127._20_4_;
        auVar144._24_4_ = (uint)!(bool)((byte)(uVar101 >> 6) & 1) * auVar127._24_4_;
        auVar144._28_4_ = (uint)!SUB81(uVar101 >> 7,0) * auVar127._28_4_;
        bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar101 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar101 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar101 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar101 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar129 = vsubps_avx512vl(auVar144,auVar133);
        auVar124 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar10._12_4_ |
                                                 (uint)!bVar20 * auVar115._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar10._8_4_ |
                                                          (uint)!bVar18 * auVar115._8_4_,
                                                          CONCAT44((uint)bVar16 * (int)auVar10._4_4_
                                                                   | (uint)!bVar16 * auVar115._4_4_,
                                                                   (uint)(bVar100 & 1) *
                                                                   (int)auVar10._0_4_ |
                                                                   (uint)!(bool)(bVar100 & 1) *
                                                                   auVar115._0_4_)))),auVar128);
        auVar135 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar119._12_4_ |
                                                 (uint)!bVar21 * auVar6._12_4_,
                                                 CONCAT48((uint)bVar19 * (int)auVar119._8_4_ |
                                                          (uint)!bVar19 * auVar6._8_4_,
                                                          CONCAT44((uint)bVar17 *
                                                                   (int)auVar119._4_4_ |
                                                                   (uint)!bVar17 * auVar6._4_4_,
                                                                   (uint)(bVar100 & 1) *
                                                                   (int)auVar119._0_4_ |
                                                                   (uint)!(bool)(bVar100 & 1) *
                                                                   auVar6._0_4_)))),auVar140);
        auVar134 = vsubps_avx(auVar133,auVar141);
        auVar127 = vsubps_avx(auVar128,auVar142);
        auVar125 = vsubps_avx(auVar140,auVar143);
        auVar52._4_4_ = auVar135._4_4_ * fVar164;
        auVar52._0_4_ = auVar135._0_4_ * fVar113;
        auVar52._8_4_ = auVar135._8_4_ * fVar166;
        auVar52._12_4_ = auVar135._12_4_ * fVar168;
        auVar52._16_4_ = auVar135._16_4_ * 0.0;
        auVar52._20_4_ = auVar135._20_4_ * 0.0;
        auVar52._24_4_ = auVar135._24_4_ * 0.0;
        auVar52._28_4_ = 0;
        auVar116 = vfmsub231ps_fma(auVar52,auVar140,auVar129);
        auVar198._0_4_ = fVar114 * auVar129._0_4_;
        auVar198._4_4_ = fVar165 * auVar129._4_4_;
        auVar198._8_4_ = fVar167 * auVar129._8_4_;
        auVar198._12_4_ = fVar169 * auVar129._12_4_;
        auVar198._16_4_ = auVar129._16_4_ * 0.0;
        auVar198._20_4_ = auVar129._20_4_ * 0.0;
        auVar198._24_4_ = auVar129._24_4_ * 0.0;
        auVar198._28_4_ = 0;
        auVar117 = vfmsub231ps_fma(auVar198,auVar133,auVar124);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),auVar121,ZEXT1632(auVar116));
        auVar204._0_4_ = auVar124._0_4_ * auVar140._0_4_;
        auVar204._4_4_ = auVar124._4_4_ * auVar140._4_4_;
        auVar204._8_4_ = auVar124._8_4_ * auVar140._8_4_;
        auVar204._12_4_ = auVar124._12_4_ * auVar140._12_4_;
        auVar204._16_4_ = auVar124._16_4_ * fVar170;
        auVar204._20_4_ = auVar124._20_4_ * fVar203;
        auVar204._24_4_ = auVar124._24_4_ * fVar208;
        auVar204._28_4_ = 0;
        auVar116 = vfmsub231ps_fma(auVar204,auVar128,auVar135);
        auVar130 = vfmadd231ps_avx512vl(auVar126,auVar121,ZEXT1632(auVar116));
        auVar126 = vmulps_avx512vl(auVar125,auVar141);
        auVar126 = vfmsub231ps_avx512vl(auVar126,auVar134,auVar143);
        auVar53._4_4_ = auVar127._4_4_ * auVar143._4_4_;
        auVar53._0_4_ = auVar127._0_4_ * auVar143._0_4_;
        auVar53._8_4_ = auVar127._8_4_ * auVar143._8_4_;
        auVar53._12_4_ = auVar127._12_4_ * auVar143._12_4_;
        auVar53._16_4_ = auVar127._16_4_ * fVar192;
        auVar53._20_4_ = auVar127._20_4_ * fVar202;
        auVar53._24_4_ = auVar127._24_4_ * fVar201;
        auVar53._28_4_ = iVar2;
        auVar116 = vfmsub231ps_fma(auVar53,auVar142,auVar125);
        auVar205._0_4_ = auVar142._0_4_ * auVar134._0_4_;
        auVar205._4_4_ = auVar142._4_4_ * auVar134._4_4_;
        auVar205._8_4_ = auVar142._8_4_ * auVar134._8_4_;
        auVar205._12_4_ = auVar142._12_4_ * auVar134._12_4_;
        auVar205._16_4_ = fVar209 * auVar134._16_4_;
        auVar205._20_4_ = fVar193 * auVar134._20_4_;
        auVar205._24_4_ = fVar200 * auVar134._24_4_;
        auVar205._28_4_ = 0;
        auVar117 = vfmsub231ps_fma(auVar205,auVar127,auVar141);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),auVar121,auVar126);
        auVar123 = vfmadd231ps_avx512vl(auVar126,auVar121,ZEXT1632(auVar116));
        auVar126 = vmaxps_avx(auVar130,auVar123);
        uVar172 = vcmpps_avx512vl(auVar126,auVar121,2);
        bVar112 = bVar112 & (byte)uVar172;
        auVar231 = ZEXT3264(local_760);
        auVar232 = ZEXT3264(local_780);
        auVar233 = ZEXT3264(local_7a0);
        if (bVar112 == 0) {
          bVar112 = 0;
        }
        else {
          auVar54._4_4_ = auVar125._4_4_ * auVar124._4_4_;
          auVar54._0_4_ = auVar125._0_4_ * auVar124._0_4_;
          auVar54._8_4_ = auVar125._8_4_ * auVar124._8_4_;
          auVar54._12_4_ = auVar125._12_4_ * auVar124._12_4_;
          auVar54._16_4_ = auVar125._16_4_ * auVar124._16_4_;
          auVar54._20_4_ = auVar125._20_4_ * auVar124._20_4_;
          auVar54._24_4_ = auVar125._24_4_ * auVar124._24_4_;
          auVar54._28_4_ = auVar126._28_4_;
          auVar115 = vfmsub231ps_fma(auVar54,auVar127,auVar135);
          auVar55._4_4_ = auVar135._4_4_ * auVar134._4_4_;
          auVar55._0_4_ = auVar135._0_4_ * auVar134._0_4_;
          auVar55._8_4_ = auVar135._8_4_ * auVar134._8_4_;
          auVar55._12_4_ = auVar135._12_4_ * auVar134._12_4_;
          auVar55._16_4_ = auVar135._16_4_ * auVar134._16_4_;
          auVar55._20_4_ = auVar135._20_4_ * auVar134._20_4_;
          auVar55._24_4_ = auVar135._24_4_ * auVar134._24_4_;
          auVar55._28_4_ = auVar135._28_4_;
          auVar117 = vfmsub231ps_fma(auVar55,auVar129,auVar125);
          auVar56._4_4_ = auVar127._4_4_ * auVar129._4_4_;
          auVar56._0_4_ = auVar127._0_4_ * auVar129._0_4_;
          auVar56._8_4_ = auVar127._8_4_ * auVar129._8_4_;
          auVar56._12_4_ = auVar127._12_4_ * auVar129._12_4_;
          auVar56._16_4_ = auVar127._16_4_ * auVar129._16_4_;
          auVar56._20_4_ = auVar127._20_4_ * auVar129._20_4_;
          auVar56._24_4_ = auVar127._24_4_ * auVar129._24_4_;
          auVar56._28_4_ = auVar127._28_4_;
          auVar6 = vfmsub231ps_fma(auVar56,auVar134,auVar124);
          auVar116 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar117),ZEXT1632(auVar6));
          auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar116),ZEXT1632(auVar115),auVar121);
          auVar124 = vrcp14ps_avx512vl(auVar126);
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = &DAT_3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar135 = vfnmadd213ps_avx512vl(auVar124,auVar126,auVar32);
          auVar116 = vfmadd132ps_fma(auVar135,auVar124,auVar124);
          auVar57._4_4_ = auVar6._4_4_ * auVar140._4_4_;
          auVar57._0_4_ = auVar6._0_4_ * auVar140._0_4_;
          auVar57._8_4_ = auVar6._8_4_ * auVar140._8_4_;
          auVar57._12_4_ = auVar6._12_4_ * auVar140._12_4_;
          auVar57._16_4_ = fVar170 * 0.0;
          auVar57._20_4_ = fVar203 * 0.0;
          auVar57._24_4_ = fVar208 * 0.0;
          auVar57._28_4_ = iVar1;
          auVar117 = vfmadd231ps_fma(auVar57,auVar128,ZEXT1632(auVar117));
          auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar133,ZEXT1632(auVar115));
          fVar203 = auVar116._0_4_;
          fVar170 = auVar116._4_4_;
          fVar208 = auVar116._8_4_;
          fVar209 = auVar116._12_4_;
          auVar124 = ZEXT1632(CONCAT412(auVar117._12_4_ * fVar209,
                                        CONCAT48(auVar117._8_4_ * fVar208,
                                                 CONCAT44(auVar117._4_4_ * fVar170,
                                                          auVar117._0_4_ * fVar203))));
          auVar219._4_4_ = uVar171;
          auVar219._0_4_ = uVar171;
          auVar219._8_4_ = uVar171;
          auVar219._12_4_ = uVar171;
          auVar219._16_4_ = uVar171;
          auVar219._20_4_ = uVar171;
          auVar219._24_4_ = uVar171;
          auVar219._28_4_ = uVar171;
          uVar172 = vcmpps_avx512vl(auVar219,auVar124,2);
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar33._4_4_ = uVar3;
          auVar33._0_4_ = uVar3;
          auVar33._8_4_ = uVar3;
          auVar33._12_4_ = uVar3;
          auVar33._16_4_ = uVar3;
          auVar33._20_4_ = uVar3;
          auVar33._24_4_ = uVar3;
          auVar33._28_4_ = uVar3;
          uVar31 = vcmpps_avx512vl(auVar124,auVar33,2);
          bVar112 = (byte)uVar172 & (byte)uVar31 & bVar112;
          if (bVar112 != 0) {
            uVar172 = vcmpps_avx512vl(auVar126,auVar121,4);
            if ((bVar112 & (byte)uVar172) != 0) {
              bVar112 = bVar112 & (byte)uVar172;
              fVar193 = auVar130._0_4_ * fVar203;
              fVar200 = auVar130._4_4_ * fVar170;
              auVar58._4_4_ = fVar200;
              auVar58._0_4_ = fVar193;
              fVar201 = auVar130._8_4_ * fVar208;
              auVar58._8_4_ = fVar201;
              fVar202 = auVar130._12_4_ * fVar209;
              auVar58._12_4_ = fVar202;
              fVar192 = auVar130._16_4_ * 0.0;
              auVar58._16_4_ = fVar192;
              fVar113 = auVar130._20_4_ * 0.0;
              auVar58._20_4_ = fVar113;
              fVar114 = auVar130._24_4_ * 0.0;
              auVar58._24_4_ = fVar114;
              auVar58._28_4_ = auVar130._28_4_;
              fVar203 = auVar123._0_4_ * fVar203;
              fVar170 = auVar123._4_4_ * fVar170;
              auVar59._4_4_ = fVar170;
              auVar59._0_4_ = fVar203;
              fVar208 = auVar123._8_4_ * fVar208;
              auVar59._8_4_ = fVar208;
              fVar209 = auVar123._12_4_ * fVar209;
              auVar59._12_4_ = fVar209;
              fVar164 = auVar123._16_4_ * 0.0;
              auVar59._16_4_ = fVar164;
              fVar165 = auVar123._20_4_ * 0.0;
              auVar59._20_4_ = fVar165;
              fVar166 = auVar123._24_4_ * 0.0;
              auVar59._24_4_ = fVar166;
              auVar59._28_4_ = auVar123._28_4_;
              auVar216._8_4_ = 0x3f800000;
              auVar216._0_8_ = &DAT_3f8000003f800000;
              auVar216._12_4_ = 0x3f800000;
              auVar216._16_4_ = 0x3f800000;
              auVar216._20_4_ = 0x3f800000;
              auVar216._24_4_ = 0x3f800000;
              auVar216._28_4_ = 0x3f800000;
              auVar126 = vsubps_avx(auVar216,auVar58);
              local_8c0._0_4_ =
                   (uint)(bVar100 & 1) * (int)fVar193 | (uint)!(bool)(bVar100 & 1) * auVar126._0_4_;
              bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
              local_8c0._4_4_ = (uint)bVar16 * (int)fVar200 | (uint)!bVar16 * auVar126._4_4_;
              bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
              local_8c0._8_4_ = (uint)bVar16 * (int)fVar201 | (uint)!bVar16 * auVar126._8_4_;
              bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
              local_8c0._12_4_ = (uint)bVar16 * (int)fVar202 | (uint)!bVar16 * auVar126._12_4_;
              bVar16 = (bool)((byte)(uVar101 >> 4) & 1);
              local_8c0._16_4_ = (uint)bVar16 * (int)fVar192 | (uint)!bVar16 * auVar126._16_4_;
              bVar16 = (bool)((byte)(uVar101 >> 5) & 1);
              local_8c0._20_4_ = (uint)bVar16 * (int)fVar113 | (uint)!bVar16 * auVar126._20_4_;
              bVar16 = (bool)((byte)(uVar101 >> 6) & 1);
              local_8c0._24_4_ = (uint)bVar16 * (int)fVar114 | (uint)!bVar16 * auVar126._24_4_;
              bVar16 = SUB81(uVar101 >> 7,0);
              local_8c0._28_4_ = (uint)bVar16 * auVar130._28_4_ | (uint)!bVar16 * auVar126._28_4_;
              auVar126 = vsubps_avx(auVar216,auVar59);
              local_580._0_4_ =
                   (uint)(bVar100 & 1) * (int)fVar203 | (uint)!(bool)(bVar100 & 1) * auVar126._0_4_;
              bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
              local_580._4_4_ = (uint)bVar16 * (int)fVar170 | (uint)!bVar16 * auVar126._4_4_;
              bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
              local_580._8_4_ = (uint)bVar16 * (int)fVar208 | (uint)!bVar16 * auVar126._8_4_;
              bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
              local_580._12_4_ = (uint)bVar16 * (int)fVar209 | (uint)!bVar16 * auVar126._12_4_;
              bVar16 = (bool)((byte)(uVar101 >> 4) & 1);
              local_580._16_4_ = (uint)bVar16 * (int)fVar164 | (uint)!bVar16 * auVar126._16_4_;
              bVar16 = (bool)((byte)(uVar101 >> 5) & 1);
              local_580._20_4_ = (uint)bVar16 * (int)fVar165 | (uint)!bVar16 * auVar126._20_4_;
              bVar16 = (bool)((byte)(uVar101 >> 6) & 1);
              local_580._24_4_ = (uint)bVar16 * (int)fVar166 | (uint)!bVar16 * auVar126._24_4_;
              bVar16 = SUB81(uVar101 >> 7,0);
              local_580._28_4_ = (uint)bVar16 * auVar123._28_4_ | (uint)!bVar16 * auVar126._28_4_;
              local_8e0 = auVar124;
              goto LAB_01d9085a;
            }
          }
          bVar112 = 0;
        }
LAB_01d9085a:
        auVar236 = ZEXT3264(local_860);
        auVar235 = ZEXT3264(local_8a0);
        auVar234 = ZEXT3264(local_880);
        auVar184 = ZEXT3264(local_840);
        if (bVar112 != 0) {
          auVar126 = vsubps_avx(auVar132,auVar131);
          auVar116 = vfmadd213ps_fma(auVar126,local_8c0,auVar131);
          uVar3 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar34._4_4_ = uVar3;
          auVar34._0_4_ = uVar3;
          auVar34._8_4_ = uVar3;
          auVar34._12_4_ = uVar3;
          auVar34._16_4_ = uVar3;
          auVar34._20_4_ = uVar3;
          auVar34._24_4_ = uVar3;
          auVar34._28_4_ = uVar3;
          auVar126 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar116._12_4_ + auVar116._12_4_,
                                                        CONCAT48(auVar116._8_4_ + auVar116._8_4_,
                                                                 CONCAT44(auVar116._4_4_ +
                                                                          auVar116._4_4_,
                                                                          auVar116._0_4_ +
                                                                          auVar116._0_4_)))),auVar34
                                    );
          uVar172 = vcmpps_avx512vl(local_8e0,auVar126,6);
          bVar112 = bVar112 & (byte)uVar172;
          if (bVar112 != 0) {
            auVar178._8_4_ = 0xbf800000;
            auVar178._0_8_ = 0xbf800000bf800000;
            auVar178._12_4_ = 0xbf800000;
            auVar178._16_4_ = 0xbf800000;
            auVar178._20_4_ = 0xbf800000;
            auVar178._24_4_ = 0xbf800000;
            auVar178._28_4_ = 0xbf800000;
            auVar35._8_4_ = 0x40000000;
            auVar35._0_8_ = 0x4000000040000000;
            auVar35._12_4_ = 0x40000000;
            auVar35._16_4_ = 0x40000000;
            auVar35._20_4_ = 0x40000000;
            auVar35._24_4_ = 0x40000000;
            auVar35._28_4_ = 0x40000000;
            local_700 = vfmadd132ps_avx512vl(local_580,auVar178,auVar35);
            local_580 = local_700;
            auVar126 = local_580;
            local_6c0 = 0;
            local_6b0 = local_9a0;
            uStack_6a8 = uStack_998;
            local_6a0 = local_930._0_8_;
            uStack_698 = local_930._8_8_;
            local_690 = local_950._0_8_;
            uStack_688 = local_950._8_8_;
            local_680 = local_940;
            uStack_678 = uStack_938;
            local_580 = auVar126;
            if ((pGVar110->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              fVar203 = 1.0 / auVar221._0_4_;
              local_660[0] = fVar203 * (local_8c0._0_4_ + 0.0);
              local_660[1] = fVar203 * (local_8c0._4_4_ + 1.0);
              local_660[2] = fVar203 * (local_8c0._8_4_ + 2.0);
              local_660[3] = fVar203 * (local_8c0._12_4_ + 3.0);
              fStack_650 = fVar203 * (local_8c0._16_4_ + 4.0);
              fStack_64c = fVar203 * (local_8c0._20_4_ + 5.0);
              fStack_648 = fVar203 * (local_8c0._24_4_ + 6.0);
              fStack_644 = local_8c0._28_4_ + 7.0;
              local_580._0_8_ = local_700._0_8_;
              local_580._8_8_ = local_700._8_8_;
              local_580._16_8_ = local_700._16_8_;
              local_580._24_8_ = local_700._24_8_;
              local_640 = local_580._0_8_;
              uStack_638 = local_580._8_8_;
              uStack_630 = local_580._16_8_;
              uStack_628 = local_580._24_8_;
              local_620 = local_8e0;
              auVar179._8_4_ = 0x7f800000;
              auVar179._0_8_ = 0x7f8000007f800000;
              auVar179._12_4_ = 0x7f800000;
              auVar179._16_4_ = 0x7f800000;
              auVar179._20_4_ = 0x7f800000;
              auVar179._24_4_ = 0x7f800000;
              auVar179._28_4_ = 0x7f800000;
              auVar126 = vblendmps_avx512vl(auVar179,local_8e0);
              auVar145._0_4_ =
                   (uint)(bVar112 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar112 & 1) * 0x7f800000;
              bVar16 = (bool)(bVar112 >> 1 & 1);
              auVar145._4_4_ = (uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar112 >> 2 & 1);
              auVar145._8_4_ = (uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar112 >> 3 & 1);
              auVar145._12_4_ = (uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar112 >> 4 & 1);
              auVar145._16_4_ = (uint)bVar16 * auVar126._16_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar112 >> 5 & 1);
              auVar145._20_4_ = (uint)bVar16 * auVar126._20_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar112 >> 6 & 1);
              auVar145._24_4_ = (uint)bVar16 * auVar126._24_4_ | (uint)!bVar16 * 0x7f800000;
              auVar145._28_4_ =
                   (uint)(bVar112 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar112 >> 7) * 0x7f800000
              ;
              auVar126 = vshufps_avx(auVar145,auVar145,0xb1);
              auVar126 = vminps_avx(auVar145,auVar126);
              auVar124 = vshufpd_avx(auVar126,auVar126,5);
              auVar126 = vminps_avx(auVar126,auVar124);
              auVar124 = vpermpd_avx2(auVar126,0x4e);
              auVar126 = vminps_avx(auVar126,auVar124);
              uVar172 = vcmpps_avx512vl(auVar145,auVar126,0);
              bVar99 = (byte)uVar172 & bVar112;
              bVar100 = bVar112;
              if (bVar99 != 0) {
                bVar100 = bVar99;
              }
              uVar107 = 0;
              for (uVar103 = (uint)bVar100; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x80000000)
              {
                uVar107 = uVar107 + 1;
              }
              uVar101 = (ulong)uVar107;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar110->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar203 = local_660[uVar101];
                uVar3 = *(undefined4 *)((long)&local_640 + uVar101 * 4);
                fVar208 = 1.0 - fVar203;
                fVar170 = fVar208 * fVar208 * -3.0;
                auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * fVar208)),
                                           ZEXT416((uint)(fVar203 * fVar208)),ZEXT416(0xc0000000));
                auVar117 = vfmsub132ss_fma(ZEXT416((uint)(fVar203 * fVar208)),
                                           ZEXT416((uint)(fVar203 * fVar203)),ZEXT416(0x40000000));
                fVar208 = auVar116._0_4_ * 3.0;
                fVar209 = auVar117._0_4_ * 3.0;
                fVar193 = fVar203 * fVar203 * 3.0;
                auVar210._0_4_ = fVar193 * (float)local_940._0_4_;
                auVar210._4_4_ = fVar193 * (float)local_940._4_4_;
                auVar210._8_4_ = fVar193 * (float)uStack_938;
                auVar210._12_4_ = fVar193 * uStack_938._4_4_;
                auVar188._4_4_ = fVar209;
                auVar188._0_4_ = fVar209;
                auVar188._8_4_ = fVar209;
                auVar188._12_4_ = fVar209;
                auVar116 = vfmadd132ps_fma(auVar188,auVar210,local_950);
                auVar194._4_4_ = fVar208;
                auVar194._0_4_ = fVar208;
                auVar194._8_4_ = fVar208;
                auVar194._12_4_ = fVar208;
                auVar116 = vfmadd132ps_fma(auVar194,auVar116,local_930);
                auVar189._4_4_ = fVar170;
                auVar189._0_4_ = fVar170;
                auVar189._8_4_ = fVar170;
                auVar189._12_4_ = fVar170;
                auVar116 = vfmadd132ps_fma(auVar189,auVar116,auVar30);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar101 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar116._0_4_;
                uVar14 = vextractps_avx(auVar116,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar14;
                uVar14 = vextractps_avx(auVar116,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar14;
                *(float *)(ray + k * 4 + 0x3c0) = fVar203;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar3;
                *(uint *)(ray + k * 4 + 0x440) = uVar12;
                *(uint *)(ray + k * 4 + 0x480) = uVar111;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
              else {
                auVar162 = vpbroadcastd_avx512f();
                local_500 = vmovdqa64_avx512f(auVar162);
                auVar162 = vpbroadcastd_avx512f();
                local_480 = vmovdqa64_avx512f(auVar162);
                local_800 = local_930._0_8_;
                uStack_7f8 = local_930._8_8_;
                local_810 = local_950._0_8_;
                uStack_808 = local_950._8_8_;
                local_820 = local_940;
                uStack_818 = uStack_938;
                local_7e0 = uVar171;
                local_720 = local_8c0;
                local_6e0 = local_8e0;
                local_6bc = iVar13;
                local_670 = bVar112;
                do {
                  auVar115 = auVar230._0_16_;
                  local_440._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar101]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_640 + uVar101 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar101 * 4);
                  local_990.context = context->user;
                  fVar209 = local_200._0_4_;
                  fVar170 = 1.0 - fVar209;
                  fVar203 = fVar170 * fVar170 * -3.0;
                  auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170)),
                                             ZEXT416((uint)(fVar209 * fVar170)),ZEXT416(0xc0000000))
                  ;
                  auVar117 = vfmsub132ss_fma(ZEXT416((uint)(fVar209 * fVar170)),
                                             ZEXT416((uint)(fVar209 * fVar209)),ZEXT416(0x40000000))
                  ;
                  fVar170 = auVar116._0_4_ * 3.0;
                  fVar208 = auVar117._0_4_ * 3.0;
                  fVar209 = fVar209 * fVar209 * 3.0;
                  auVar213._0_4_ = fVar209 * (float)local_820;
                  auVar213._4_4_ = fVar209 * local_820._4_4_;
                  auVar213._8_4_ = fVar209 * (float)uStack_818;
                  auVar213._12_4_ = fVar209 * uStack_818._4_4_;
                  auVar175._4_4_ = fVar208;
                  auVar175._0_4_ = fVar208;
                  auVar175._8_4_ = fVar208;
                  auVar175._12_4_ = fVar208;
                  auVar94._8_8_ = uStack_808;
                  auVar94._0_8_ = local_810;
                  auVar116 = vfmadd132ps_fma(auVar175,auVar213,auVar94);
                  auVar197._4_4_ = fVar170;
                  auVar197._0_4_ = fVar170;
                  auVar197._8_4_ = fVar170;
                  auVar197._12_4_ = fVar170;
                  auVar96._8_8_ = uStack_7f8;
                  auVar96._0_8_ = local_800;
                  auVar116 = vfmadd132ps_fma(auVar197,auVar116,auVar96);
                  auVar176._4_4_ = fVar203;
                  auVar176._0_4_ = fVar203;
                  auVar176._8_4_ = fVar203;
                  auVar176._12_4_ = fVar203;
                  auVar116 = vfmadd132ps_fma(auVar176,auVar116,auVar30);
                  auVar162 = vbroadcastss_avx512f(auVar116);
                  auVar238 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar238,ZEXT1664(auVar116));
                  auVar238 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar238,ZEXT1664(auVar116));
                  local_2c0[0] = (RTCHitN)auVar162[0];
                  local_2c0[1] = (RTCHitN)auVar162[1];
                  local_2c0[2] = (RTCHitN)auVar162[2];
                  local_2c0[3] = (RTCHitN)auVar162[3];
                  local_2c0[4] = (RTCHitN)auVar162[4];
                  local_2c0[5] = (RTCHitN)auVar162[5];
                  local_2c0[6] = (RTCHitN)auVar162[6];
                  local_2c0[7] = (RTCHitN)auVar162[7];
                  local_2c0[8] = (RTCHitN)auVar162[8];
                  local_2c0[9] = (RTCHitN)auVar162[9];
                  local_2c0[10] = (RTCHitN)auVar162[10];
                  local_2c0[0xb] = (RTCHitN)auVar162[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar162[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar162[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar162[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar162[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar162[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar162[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar162[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar162[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar162[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar162[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar162[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar162[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar162[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar162[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar162[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar162[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar162[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar162[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar162[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar162[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar162[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar162[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar162[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar162[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar162[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar162[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar162[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar162[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar162[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar162[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar162[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar162[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar162[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar162[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar162[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar162[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar162[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar162[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar162[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar162[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar162[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar162[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar162[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar162[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar162[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar162[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar162[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar162[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar162[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar162[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar162[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar162[0x3f];
                  local_180 = local_480._0_8_;
                  uStack_178 = local_480._8_8_;
                  uStack_170 = local_480._16_8_;
                  uStack_168 = local_480._24_8_;
                  uStack_160 = local_480._32_8_;
                  uStack_158 = local_480._40_8_;
                  uStack_150 = local_480._48_8_;
                  uStack_148 = local_480._56_8_;
                  auVar162 = vmovdqa64_avx512f(local_500);
                  local_140 = vmovdqa64_avx512f(auVar162);
                  auVar126 = vpcmpeqd_avx2(auVar162._0_32_,auVar162._0_32_);
                  local_958[3] = auVar126;
                  local_958[2] = auVar126;
                  local_958[1] = auVar126;
                  *local_958 = auVar126;
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_990.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_990.context)->instPrimID[0]));
                  local_600 = local_300;
                  local_990.valid = (int *)local_600;
                  local_990.geometryUserPtr = pGVar110->userPtr;
                  local_990.hit = local_2c0;
                  local_990.N = 0x10;
                  local_4c0._0_8_ = uVar101;
                  local_990.ray = (RTCRayN *)ray;
                  if (pGVar110->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar110->intersectionFilterN)(&local_990);
                    auVar235 = ZEXT3264(local_8a0);
                    auVar234 = ZEXT3264(local_880);
                    auVar236 = ZEXT3264(local_860);
                    auVar184 = ZEXT3264(local_840);
                    auVar237 = ZEXT3264(local_7c0);
                    auVar233 = ZEXT3264(local_7a0);
                    auVar232 = ZEXT3264(local_780);
                    auVar231 = ZEXT3264(local_760);
                    auVar116 = vxorps_avx512vl(auVar115,auVar115);
                    auVar230 = ZEXT1664(auVar116);
                    uVar101 = local_4c0._0_8_;
                    uVar171 = local_7e0;
                  }
                  auVar116 = auVar230._0_16_;
                  auVar162 = vmovdqa64_avx512f(local_600);
                  uVar172 = vptestmd_avx512f(auVar162,auVar162);
                  if ((short)uVar172 == 0) {
LAB_01d91e82:
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_440._0_4_;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar110->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_990);
                      auVar235 = ZEXT3264(local_8a0);
                      auVar234 = ZEXT3264(local_880);
                      auVar236 = ZEXT3264(local_860);
                      auVar184 = ZEXT3264(local_840);
                      auVar237 = ZEXT3264(local_7c0);
                      auVar233 = ZEXT3264(local_7a0);
                      auVar232 = ZEXT3264(local_780);
                      auVar231 = ZEXT3264(local_760);
                      auVar116 = vxorps_avx512vl(auVar116,auVar116);
                      auVar230 = ZEXT1664(auVar116);
                      uVar101 = local_4c0._0_8_;
                      uVar171 = local_7e0;
                    }
                    auVar162 = vmovdqa64_avx512f(local_600);
                    uVar105 = vptestmd_avx512f(auVar162,auVar162);
                    if ((short)uVar105 == 0) goto LAB_01d91e82;
                    iVar1 = *(int *)(local_990.hit + 4);
                    iVar2 = *(int *)(local_990.hit + 8);
                    iVar80 = *(int *)(local_990.hit + 0xc);
                    iVar81 = *(int *)(local_990.hit + 0x10);
                    iVar82 = *(int *)(local_990.hit + 0x14);
                    iVar83 = *(int *)(local_990.hit + 0x18);
                    iVar84 = *(int *)(local_990.hit + 0x1c);
                    iVar85 = *(int *)(local_990.hit + 0x20);
                    iVar86 = *(int *)(local_990.hit + 0x24);
                    iVar87 = *(int *)(local_990.hit + 0x28);
                    iVar88 = *(int *)(local_990.hit + 0x2c);
                    iVar89 = *(int *)(local_990.hit + 0x30);
                    iVar90 = *(int *)(local_990.hit + 0x34);
                    iVar91 = *(int *)(local_990.hit + 0x38);
                    iVar92 = *(int *)(local_990.hit + 0x3c);
                    bVar100 = (byte)uVar105;
                    bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar105 >> 7) & 1);
                    bVar99 = (byte)(uVar105 >> 8);
                    bVar23 = (bool)((byte)(uVar105 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar105 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar105 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar105 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar105 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar105 >> 0xe) & 1);
                    bVar29 = SUB81(uVar105 >> 0xf,0);
                    *(uint *)(local_990.ray + 0x300) =
                         (uint)(bVar100 & 1) * *(int *)local_990.hit |
                         (uint)!(bool)(bVar100 & 1) * *(int *)(local_990.ray + 0x300);
                    *(uint *)(local_990.ray + 0x304) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_990.ray + 0x304);
                    *(uint *)(local_990.ray + 0x308) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_990.ray + 0x308);
                    *(uint *)(local_990.ray + 0x30c) =
                         (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_990.ray + 0x30c);
                    *(uint *)(local_990.ray + 0x310) =
                         (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_990.ray + 0x310);
                    *(uint *)(local_990.ray + 0x314) =
                         (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_990.ray + 0x314);
                    *(uint *)(local_990.ray + 0x318) =
                         (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_990.ray + 0x318);
                    *(uint *)(local_990.ray + 0x31c) =
                         (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_990.ray + 0x31c);
                    *(uint *)(local_990.ray + 800) =
                         (uint)(bVar99 & 1) * iVar85 |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_990.ray + 800);
                    *(uint *)(local_990.ray + 0x324) =
                         (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_990.ray + 0x324);
                    *(uint *)(local_990.ray + 0x328) =
                         (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_990.ray + 0x328);
                    *(uint *)(local_990.ray + 0x32c) =
                         (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_990.ray + 0x32c);
                    *(uint *)(local_990.ray + 0x330) =
                         (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_990.ray + 0x330);
                    *(uint *)(local_990.ray + 0x334) =
                         (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_990.ray + 0x334);
                    *(uint *)(local_990.ray + 0x338) =
                         (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_990.ray + 0x338);
                    *(uint *)(local_990.ray + 0x33c) =
                         (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_990.ray + 0x33c);
                    iVar1 = *(int *)(local_990.hit + 0x44);
                    iVar2 = *(int *)(local_990.hit + 0x48);
                    iVar80 = *(int *)(local_990.hit + 0x4c);
                    iVar81 = *(int *)(local_990.hit + 0x50);
                    iVar82 = *(int *)(local_990.hit + 0x54);
                    iVar83 = *(int *)(local_990.hit + 0x58);
                    iVar84 = *(int *)(local_990.hit + 0x5c);
                    iVar85 = *(int *)(local_990.hit + 0x60);
                    iVar86 = *(int *)(local_990.hit + 100);
                    iVar87 = *(int *)(local_990.hit + 0x68);
                    iVar88 = *(int *)(local_990.hit + 0x6c);
                    iVar89 = *(int *)(local_990.hit + 0x70);
                    iVar90 = *(int *)(local_990.hit + 0x74);
                    iVar91 = *(int *)(local_990.hit + 0x78);
                    iVar92 = *(int *)(local_990.hit + 0x7c);
                    bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar105 >> 7) & 1);
                    bVar23 = (bool)((byte)(uVar105 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar105 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar105 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar105 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar105 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar105 >> 0xe) & 1);
                    bVar29 = SUB81(uVar105 >> 0xf,0);
                    *(uint *)(local_990.ray + 0x340) =
                         (uint)(bVar100 & 1) * *(int *)(local_990.hit + 0x40) |
                         (uint)!(bool)(bVar100 & 1) * *(int *)(local_990.ray + 0x340);
                    *(uint *)(local_990.ray + 0x344) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_990.ray + 0x344);
                    *(uint *)(local_990.ray + 0x348) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_990.ray + 0x348);
                    *(uint *)(local_990.ray + 0x34c) =
                         (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_990.ray + 0x34c);
                    *(uint *)(local_990.ray + 0x350) =
                         (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_990.ray + 0x350);
                    *(uint *)(local_990.ray + 0x354) =
                         (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_990.ray + 0x354);
                    *(uint *)(local_990.ray + 0x358) =
                         (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_990.ray + 0x358);
                    *(uint *)(local_990.ray + 0x35c) =
                         (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_990.ray + 0x35c);
                    *(uint *)(local_990.ray + 0x360) =
                         (uint)(bVar99 & 1) * iVar85 |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_990.ray + 0x360);
                    *(uint *)(local_990.ray + 0x364) =
                         (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_990.ray + 0x364);
                    *(uint *)(local_990.ray + 0x368) =
                         (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_990.ray + 0x368);
                    *(uint *)(local_990.ray + 0x36c) =
                         (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_990.ray + 0x36c);
                    *(uint *)(local_990.ray + 0x370) =
                         (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_990.ray + 0x370);
                    *(uint *)(local_990.ray + 0x374) =
                         (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_990.ray + 0x374);
                    *(uint *)(local_990.ray + 0x378) =
                         (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_990.ray + 0x378);
                    *(uint *)(local_990.ray + 0x37c) =
                         (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_990.ray + 0x37c);
                    iVar1 = *(int *)(local_990.hit + 0x84);
                    iVar2 = *(int *)(local_990.hit + 0x88);
                    iVar80 = *(int *)(local_990.hit + 0x8c);
                    iVar81 = *(int *)(local_990.hit + 0x90);
                    iVar82 = *(int *)(local_990.hit + 0x94);
                    iVar83 = *(int *)(local_990.hit + 0x98);
                    iVar84 = *(int *)(local_990.hit + 0x9c);
                    iVar85 = *(int *)(local_990.hit + 0xa0);
                    iVar86 = *(int *)(local_990.hit + 0xa4);
                    iVar87 = *(int *)(local_990.hit + 0xa8);
                    iVar88 = *(int *)(local_990.hit + 0xac);
                    iVar89 = *(int *)(local_990.hit + 0xb0);
                    iVar90 = *(int *)(local_990.hit + 0xb4);
                    iVar91 = *(int *)(local_990.hit + 0xb8);
                    iVar92 = *(int *)(local_990.hit + 0xbc);
                    bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar105 >> 7) & 1);
                    bVar23 = (bool)((byte)(uVar105 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar105 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar105 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar105 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar105 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar105 >> 0xe) & 1);
                    bVar29 = SUB81(uVar105 >> 0xf,0);
                    *(uint *)(local_990.ray + 0x380) =
                         (uint)(bVar100 & 1) * *(int *)(local_990.hit + 0x80) |
                         (uint)!(bool)(bVar100 & 1) * *(int *)(local_990.ray + 0x380);
                    *(uint *)(local_990.ray + 900) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_990.ray + 900);
                    *(uint *)(local_990.ray + 0x388) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_990.ray + 0x388);
                    *(uint *)(local_990.ray + 0x38c) =
                         (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_990.ray + 0x38c);
                    *(uint *)(local_990.ray + 0x390) =
                         (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_990.ray + 0x390);
                    *(uint *)(local_990.ray + 0x394) =
                         (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_990.ray + 0x394);
                    *(uint *)(local_990.ray + 0x398) =
                         (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_990.ray + 0x398);
                    *(uint *)(local_990.ray + 0x39c) =
                         (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_990.ray + 0x39c);
                    *(uint *)(local_990.ray + 0x3a0) =
                         (uint)(bVar99 & 1) * iVar85 |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_990.ray + 0x3a0);
                    *(uint *)(local_990.ray + 0x3a4) =
                         (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_990.ray + 0x3a4);
                    *(uint *)(local_990.ray + 0x3a8) =
                         (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_990.ray + 0x3a8);
                    *(uint *)(local_990.ray + 0x3ac) =
                         (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_990.ray + 0x3ac);
                    *(uint *)(local_990.ray + 0x3b0) =
                         (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_990.ray + 0x3b0);
                    *(uint *)(local_990.ray + 0x3b4) =
                         (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_990.ray + 0x3b4);
                    *(uint *)(local_990.ray + 0x3b8) =
                         (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_990.ray + 0x3b8);
                    *(uint *)(local_990.ray + 0x3bc) =
                         (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_990.ray + 0x3bc);
                    iVar1 = *(int *)(local_990.hit + 0xc4);
                    iVar2 = *(int *)(local_990.hit + 200);
                    iVar80 = *(int *)(local_990.hit + 0xcc);
                    iVar81 = *(int *)(local_990.hit + 0xd0);
                    iVar82 = *(int *)(local_990.hit + 0xd4);
                    iVar83 = *(int *)(local_990.hit + 0xd8);
                    iVar84 = *(int *)(local_990.hit + 0xdc);
                    iVar85 = *(int *)(local_990.hit + 0xe0);
                    iVar86 = *(int *)(local_990.hit + 0xe4);
                    iVar87 = *(int *)(local_990.hit + 0xe8);
                    iVar88 = *(int *)(local_990.hit + 0xec);
                    iVar89 = *(int *)(local_990.hit + 0xf0);
                    iVar90 = *(int *)(local_990.hit + 0xf4);
                    iVar91 = *(int *)(local_990.hit + 0xf8);
                    iVar92 = *(int *)(local_990.hit + 0xfc);
                    bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar105 >> 7) & 1);
                    bVar23 = (bool)((byte)(uVar105 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar105 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar105 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar105 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar105 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar105 >> 0xe) & 1);
                    bVar29 = SUB81(uVar105 >> 0xf,0);
                    *(uint *)(local_990.ray + 0x3c0) =
                         (uint)(bVar100 & 1) * *(int *)(local_990.hit + 0xc0) |
                         (uint)!(bool)(bVar100 & 1) * *(int *)(local_990.ray + 0x3c0);
                    *(uint *)(local_990.ray + 0x3c4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_990.ray + 0x3c4);
                    *(uint *)(local_990.ray + 0x3c8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_990.ray + 0x3c8);
                    *(uint *)(local_990.ray + 0x3cc) =
                         (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_990.ray + 0x3cc);
                    *(uint *)(local_990.ray + 0x3d0) =
                         (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_990.ray + 0x3d0);
                    *(uint *)(local_990.ray + 0x3d4) =
                         (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_990.ray + 0x3d4);
                    *(uint *)(local_990.ray + 0x3d8) =
                         (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_990.ray + 0x3d8);
                    *(uint *)(local_990.ray + 0x3dc) =
                         (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_990.ray + 0x3dc);
                    *(uint *)(local_990.ray + 0x3e0) =
                         (uint)(bVar99 & 1) * iVar85 |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_990.ray + 0x3e0);
                    *(uint *)(local_990.ray + 0x3e4) =
                         (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_990.ray + 0x3e4);
                    *(uint *)(local_990.ray + 1000) =
                         (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_990.ray + 1000);
                    *(uint *)(local_990.ray + 0x3ec) =
                         (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_990.ray + 0x3ec);
                    *(uint *)(local_990.ray + 0x3f0) =
                         (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_990.ray + 0x3f0);
                    *(uint *)(local_990.ray + 0x3f4) =
                         (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_990.ray + 0x3f4);
                    *(uint *)(local_990.ray + 0x3f8) =
                         (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_990.ray + 0x3f8);
                    *(uint *)(local_990.ray + 0x3fc) =
                         (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_990.ray + 0x3fc);
                    iVar1 = *(int *)(local_990.hit + 0x104);
                    iVar2 = *(int *)(local_990.hit + 0x108);
                    iVar80 = *(int *)(local_990.hit + 0x10c);
                    iVar81 = *(int *)(local_990.hit + 0x110);
                    iVar82 = *(int *)(local_990.hit + 0x114);
                    iVar83 = *(int *)(local_990.hit + 0x118);
                    iVar84 = *(int *)(local_990.hit + 0x11c);
                    iVar85 = *(int *)(local_990.hit + 0x120);
                    iVar86 = *(int *)(local_990.hit + 0x124);
                    iVar87 = *(int *)(local_990.hit + 0x128);
                    iVar88 = *(int *)(local_990.hit + 300);
                    iVar89 = *(int *)(local_990.hit + 0x130);
                    iVar90 = *(int *)(local_990.hit + 0x134);
                    iVar91 = *(int *)(local_990.hit + 0x138);
                    iVar92 = *(int *)(local_990.hit + 0x13c);
                    bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar105 >> 7) & 1);
                    bVar23 = (bool)((byte)(uVar105 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar105 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar105 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar105 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar105 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar105 >> 0xe) & 1);
                    bVar29 = SUB81(uVar105 >> 0xf,0);
                    *(uint *)(local_990.ray + 0x400) =
                         (uint)(bVar100 & 1) * *(int *)(local_990.hit + 0x100) |
                         (uint)!(bool)(bVar100 & 1) * *(int *)(local_990.ray + 0x400);
                    *(uint *)(local_990.ray + 0x404) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_990.ray + 0x404);
                    *(uint *)(local_990.ray + 0x408) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_990.ray + 0x408);
                    *(uint *)(local_990.ray + 0x40c) =
                         (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_990.ray + 0x40c);
                    *(uint *)(local_990.ray + 0x410) =
                         (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_990.ray + 0x410);
                    *(uint *)(local_990.ray + 0x414) =
                         (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_990.ray + 0x414);
                    *(uint *)(local_990.ray + 0x418) =
                         (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_990.ray + 0x418);
                    *(uint *)(local_990.ray + 0x41c) =
                         (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_990.ray + 0x41c);
                    *(uint *)(local_990.ray + 0x420) =
                         (uint)(bVar99 & 1) * iVar85 |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_990.ray + 0x420);
                    *(uint *)(local_990.ray + 0x424) =
                         (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_990.ray + 0x424);
                    *(uint *)(local_990.ray + 0x428) =
                         (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_990.ray + 0x428);
                    *(uint *)(local_990.ray + 0x42c) =
                         (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_990.ray + 0x42c);
                    *(uint *)(local_990.ray + 0x430) =
                         (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_990.ray + 0x430);
                    *(uint *)(local_990.ray + 0x434) =
                         (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_990.ray + 0x434);
                    *(uint *)(local_990.ray + 0x438) =
                         (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_990.ray + 0x438);
                    *(uint *)(local_990.ray + 0x43c) =
                         (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_990.ray + 0x43c);
                    auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_990.hit + 0x140));
                    auVar162 = vmovdqu32_avx512f(auVar162);
                    *(undefined1 (*) [64])(local_990.ray + 0x440) = auVar162;
                    auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_990.hit + 0x180));
                    auVar162 = vmovdqu32_avx512f(auVar162);
                    *(undefined1 (*) [64])(local_990.ray + 0x480) = auVar162;
                    auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_990.hit + 0x1c0));
                    auVar162 = vmovdqa32_avx512f(auVar162);
                    *(undefined1 (*) [64])(local_990.ray + 0x4c0) = auVar162;
                    auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_990.hit + 0x200));
                    auVar162 = vmovdqa32_avx512f(auVar162);
                    *(undefined1 (*) [64])(local_990.ray + 0x500) = auVar162;
                  }
                  bVar100 = ~(byte)(1 << ((uint)uVar101 & 0x1f)) & bVar112;
                  uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
                  auVar42._4_4_ = uVar3;
                  auVar42._0_4_ = uVar3;
                  auVar42._8_4_ = uVar3;
                  auVar42._12_4_ = uVar3;
                  auVar42._16_4_ = uVar3;
                  auVar42._20_4_ = uVar3;
                  auVar42._24_4_ = uVar3;
                  auVar42._28_4_ = uVar3;
                  uVar172 = vcmpps_avx512vl(local_8e0,auVar42,2);
                  bVar112 = bVar100 & (byte)uVar172;
                  if ((bVar100 & (byte)uVar172) != 0) {
                    auVar183._8_4_ = 0x7f800000;
                    auVar183._0_8_ = 0x7f8000007f800000;
                    auVar183._12_4_ = 0x7f800000;
                    auVar183._16_4_ = 0x7f800000;
                    auVar183._20_4_ = 0x7f800000;
                    auVar183._24_4_ = 0x7f800000;
                    auVar183._28_4_ = 0x7f800000;
                    auVar126 = vblendmps_avx512vl(auVar183,local_8e0);
                    auVar161._0_4_ =
                         (uint)(bVar112 & 1) * auVar126._0_4_ |
                         (uint)!(bool)(bVar112 & 1) * 0x7f800000;
                    bVar16 = (bool)(bVar112 >> 1 & 1);
                    auVar161._4_4_ = (uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar112 >> 2 & 1);
                    auVar161._8_4_ = (uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar112 >> 3 & 1);
                    auVar161._12_4_ = (uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar112 >> 4 & 1);
                    auVar161._16_4_ = (uint)bVar16 * auVar126._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar112 >> 5 & 1);
                    auVar161._20_4_ = (uint)bVar16 * auVar126._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar112 >> 6 & 1);
                    auVar161._24_4_ = (uint)bVar16 * auVar126._24_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar161._28_4_ =
                         (uint)(bVar112 >> 7) * auVar126._28_4_ |
                         (uint)!(bool)(bVar112 >> 7) * 0x7f800000;
                    auVar126 = vshufps_avx(auVar161,auVar161,0xb1);
                    auVar126 = vminps_avx(auVar161,auVar126);
                    auVar124 = vshufpd_avx(auVar126,auVar126,5);
                    auVar126 = vminps_avx(auVar126,auVar124);
                    auVar124 = vpermpd_avx2(auVar126,0x4e);
                    auVar126 = vminps_avx(auVar126,auVar124);
                    uVar172 = vcmpps_avx512vl(auVar161,auVar126,0);
                    bVar99 = (byte)uVar172 & bVar112;
                    bVar100 = bVar112;
                    if (bVar99 != 0) {
                      bVar100 = bVar99;
                    }
                    uVar107 = 0;
                    for (uVar103 = (uint)bVar100; (uVar103 & 1) == 0;
                        uVar103 = uVar103 >> 1 | 0x80000000) {
                      uVar107 = uVar107 + 1;
                    }
                    uVar101 = (ulong)uVar107;
                  }
                } while (bVar112 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar13) {
        auVar126 = vpbroadcastd_avx512vl();
        auVar238 = ZEXT3264(auVar126);
        local_7e0 = local_5a0;
        uStack_7dc = local_5a0;
        uStack_7d8 = local_5a0;
        uStack_7d4 = local_5a0;
        uStack_7d0 = local_5a0;
        uStack_7cc = local_5a0;
        uStack_7c8 = local_5a0;
        uStack_7c4 = local_5a0;
        local_5a0 = uVar171;
        uStack_59c = uVar171;
        uStack_598 = uVar171;
        uStack_594 = uVar171;
        uStack_590 = uVar171;
        uStack_58c = uVar171;
        uStack_588 = uVar171;
        uStack_584 = uVar171;
        fStack_730 = 1.0 / (float)local_740._0_4_;
        local_740._4_4_ = fStack_730;
        local_740._0_4_ = fStack_730;
        fStack_738 = fStack_730;
        fStack_734 = fStack_730;
        auVar162 = vpbroadcastd_avx512f();
        local_4c0 = vmovdqa64_avx512f(auVar162);
        auVar162 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar162);
        lVar108 = 8;
        fStack_72c = fStack_730;
        fStack_728 = fStack_730;
        fStack_724 = fStack_730;
        do {
          auVar126 = vpbroadcastd_avx512vl();
          auVar127 = vpor_avx2(auVar126,_DAT_0205a920);
          uVar31 = vpcmpgtd_avx512vl(auVar238._0_32_,auVar127);
          auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar108 * 4 + lVar79);
          auVar124 = *(undefined1 (*) [32])(lVar79 + 0x2227768 + lVar108 * 4);
          auVar135 = *(undefined1 (*) [32])(lVar79 + 0x2227bec + lVar108 * 4);
          auVar134 = *(undefined1 (*) [32])(lVar79 + 0x2228070 + lVar108 * 4);
          local_880 = auVar234._0_32_;
          auVar125 = vmulps_avx512vl(local_880,auVar134);
          local_8a0 = auVar235._0_32_;
          auVar133 = vmulps_avx512vl(local_8a0,auVar134);
          auVar60._4_4_ = auVar134._4_4_ * (float)local_380._4_4_;
          auVar60._0_4_ = auVar134._0_4_ * (float)local_380._0_4_;
          auVar60._8_4_ = auVar134._8_4_ * fStack_378;
          auVar60._12_4_ = auVar134._12_4_ * fStack_374;
          auVar60._16_4_ = auVar134._16_4_ * fStack_370;
          auVar60._20_4_ = auVar134._20_4_ * fStack_36c;
          auVar60._24_4_ = auVar134._24_4_ * fStack_368;
          auVar60._28_4_ = auVar127._28_4_;
          local_840 = auVar184._0_32_;
          auVar127 = vfmadd231ps_avx512vl(auVar125,auVar135,local_840);
          local_860 = auVar236._0_32_;
          auVar125 = vfmadd231ps_avx512vl(auVar133,auVar135,local_860);
          auVar116 = vfmadd231ps_fma(auVar60,auVar135,local_360);
          auVar218 = auVar233._0_32_;
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar124,auVar218);
          auVar225 = auVar237._0_32_;
          auVar125 = vfmadd231ps_avx512vl(auVar125,auVar124,auVar225);
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar124,local_340);
          auVar214 = auVar231._0_32_;
          auVar123 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar214);
          auVar215 = auVar232._0_32_;
          auVar131 = vfmadd231ps_avx512vl(auVar125,auVar126,auVar215);
          auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar108 * 4 + lVar79);
          auVar125 = *(undefined1 (*) [32])(lVar79 + 0x2229b88 + lVar108 * 4);
          auVar132 = vfmadd231ps_avx512vl(ZEXT1632(auVar116),auVar126,local_3a0);
          auVar133 = *(undefined1 (*) [32])(lVar79 + 0x222a00c + lVar108 * 4);
          auVar128 = *(undefined1 (*) [32])(lVar79 + 0x222a490 + lVar108 * 4);
          auVar129 = vmulps_avx512vl(local_880,auVar128);
          auVar130 = vmulps_avx512vl(local_8a0,auVar128);
          auVar61._4_4_ = auVar128._4_4_ * (float)local_380._4_4_;
          auVar61._0_4_ = auVar128._0_4_ * (float)local_380._0_4_;
          auVar61._8_4_ = auVar128._8_4_ * fStack_378;
          auVar61._12_4_ = auVar128._12_4_ * fStack_374;
          auVar61._16_4_ = auVar128._16_4_ * fStack_370;
          auVar61._20_4_ = auVar128._20_4_ * fStack_36c;
          auVar61._24_4_ = auVar128._24_4_ * fStack_368;
          auVar61._28_4_ = uStack_364;
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar133,local_840);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar133,local_860);
          auVar116 = vfmadd231ps_fma(auVar61,auVar133,local_360);
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar125,auVar218);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar125,auVar225);
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar125,local_340);
          auVar121 = vfmadd231ps_avx512vl(auVar129,auVar127,auVar214);
          auVar122 = vfmadd231ps_avx512vl(auVar130,auVar127,auVar215);
          auVar146 = vfmadd231ps_avx512vl(ZEXT1632(auVar116),auVar127,local_3a0);
          auVar147 = vmaxps_avx512vl(auVar132,auVar146);
          auVar129 = vsubps_avx(auVar121,auVar123);
          auVar130 = vsubps_avx(auVar122,auVar131);
          auVar148 = vmulps_avx512vl(auVar131,auVar129);
          auVar149 = vmulps_avx512vl(auVar123,auVar130);
          auVar148 = vsubps_avx512vl(auVar148,auVar149);
          auVar149 = vmulps_avx512vl(auVar130,auVar130);
          auVar149 = vfmadd231ps_avx512vl(auVar149,auVar129,auVar129);
          auVar147 = vmulps_avx512vl(auVar147,auVar147);
          auVar147 = vmulps_avx512vl(auVar147,auVar149);
          auVar148 = vmulps_avx512vl(auVar148,auVar148);
          uVar172 = vcmpps_avx512vl(auVar148,auVar147,2);
          local_670 = (byte)uVar31 & (byte)uVar172;
          if (local_670 == 0) {
            auVar237 = ZEXT3264(auVar225);
          }
          else {
            auVar128 = vmulps_avx512vl(local_3e0,auVar128);
            auVar133 = vfmadd213ps_avx512vl(auVar133,local_3c0,auVar128);
            auVar125 = vfmadd213ps_avx512vl(auVar125,local_540,auVar133);
            auVar127 = vfmadd213ps_avx512vl(auVar127,local_520,auVar125);
            auVar134 = vmulps_avx512vl(local_3e0,auVar134);
            auVar135 = vfmadd213ps_avx512vl(auVar135,local_3c0,auVar134);
            auVar124 = vfmadd213ps_avx512vl(auVar124,local_540,auVar135);
            auVar125 = vfmadd213ps_avx512vl(auVar126,local_520,auVar124);
            auVar126 = *(undefined1 (*) [32])(lVar79 + 0x22284f4 + lVar108 * 4);
            auVar124 = *(undefined1 (*) [32])(lVar79 + 0x2228978 + lVar108 * 4);
            auVar135 = *(undefined1 (*) [32])(lVar79 + 0x2228dfc + lVar108 * 4);
            auVar134 = *(undefined1 (*) [32])(lVar79 + 0x2229280 + lVar108 * 4);
            auVar133 = vmulps_avx512vl(local_880,auVar134);
            auVar128 = vmulps_avx512vl(local_8a0,auVar134);
            auVar134 = vmulps_avx512vl(local_3e0,auVar134);
            auVar133 = vfmadd231ps_avx512vl(auVar133,auVar135,local_840);
            auVar128 = vfmadd231ps_avx512vl(auVar128,auVar135,local_860);
            auVar135 = vfmadd231ps_avx512vl(auVar134,local_3c0,auVar135);
            auVar134 = vfmadd231ps_avx512vl(auVar133,auVar124,auVar218);
            auVar133 = vfmadd231ps_avx512vl(auVar128,auVar124,auVar225);
            auVar124 = vfmadd231ps_avx512vl(auVar135,local_540,auVar124);
            auVar134 = vfmadd231ps_avx512vl(auVar134,auVar126,auVar214);
            auVar133 = vfmadd231ps_avx512vl(auVar133,auVar126,auVar215);
            auVar128 = vfmadd231ps_avx512vl(auVar124,local_520,auVar126);
            auVar126 = *(undefined1 (*) [32])(lVar79 + 0x222a914 + lVar108 * 4);
            auVar124 = *(undefined1 (*) [32])(lVar79 + 0x222b21c + lVar108 * 4);
            auVar135 = *(undefined1 (*) [32])(lVar79 + 0x222b6a0 + lVar108 * 4);
            auVar147 = vmulps_avx512vl(local_880,auVar135);
            auVar148 = vmulps_avx512vl(local_8a0,auVar135);
            auVar135 = vmulps_avx512vl(local_3e0,auVar135);
            auVar147 = vfmadd231ps_avx512vl(auVar147,auVar124,local_840);
            auVar148 = vfmadd231ps_avx512vl(auVar148,auVar124,local_860);
            auVar135 = vfmadd231ps_avx512vl(auVar135,local_3c0,auVar124);
            auVar124 = *(undefined1 (*) [32])(lVar79 + 0x222ad98 + lVar108 * 4);
            auVar147 = vfmadd231ps_avx512vl(auVar147,auVar124,auVar218);
            auVar148 = vfmadd231ps_avx512vl(auVar148,auVar124,auVar225);
            auVar124 = vfmadd231ps_avx512vl(auVar135,local_540,auVar124);
            auVar135 = vfmadd231ps_avx512vl(auVar147,auVar126,auVar214);
            auVar147 = vfmadd231ps_avx512vl(auVar148,auVar126,auVar215);
            auVar124 = vfmadd231ps_avx512vl(auVar124,local_520,auVar126);
            auVar148 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar134,auVar148);
            vandps_avx512vl(auVar133,auVar148);
            auVar126 = vmaxps_avx(auVar148,auVar148);
            vandps_avx512vl(auVar128,auVar148);
            auVar126 = vmaxps_avx(auVar126,auVar148);
            auVar97._4_4_ = uStack_7dc;
            auVar97._0_4_ = local_7e0;
            auVar97._8_4_ = uStack_7d8;
            auVar97._12_4_ = uStack_7d4;
            auVar97._16_4_ = uStack_7d0;
            auVar97._20_4_ = uStack_7cc;
            auVar97._24_4_ = uStack_7c8;
            auVar97._28_4_ = uStack_7c4;
            uVar101 = vcmpps_avx512vl(auVar126,auVar97,1);
            bVar16 = (bool)((byte)uVar101 & 1);
            auVar150._0_4_ = (float)((uint)bVar16 * auVar129._0_4_ | (uint)!bVar16 * auVar134._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar150._4_4_ = (float)((uint)bVar16 * auVar129._4_4_ | (uint)!bVar16 * auVar134._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar150._8_4_ = (float)((uint)bVar16 * auVar129._8_4_ | (uint)!bVar16 * auVar134._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar150._12_4_ =
                 (float)((uint)bVar16 * auVar129._12_4_ | (uint)!bVar16 * auVar134._12_4_);
            bVar16 = (bool)((byte)(uVar101 >> 4) & 1);
            auVar150._16_4_ =
                 (float)((uint)bVar16 * auVar129._16_4_ | (uint)!bVar16 * auVar134._16_4_);
            bVar16 = (bool)((byte)(uVar101 >> 5) & 1);
            auVar150._20_4_ =
                 (float)((uint)bVar16 * auVar129._20_4_ | (uint)!bVar16 * auVar134._20_4_);
            bVar16 = (bool)((byte)(uVar101 >> 6) & 1);
            auVar150._24_4_ =
                 (float)((uint)bVar16 * auVar129._24_4_ | (uint)!bVar16 * auVar134._24_4_);
            bVar16 = SUB81(uVar101 >> 7,0);
            auVar150._28_4_ = (uint)bVar16 * auVar129._28_4_ | (uint)!bVar16 * auVar134._28_4_;
            bVar16 = (bool)((byte)uVar101 & 1);
            auVar151._0_4_ = (float)((uint)bVar16 * auVar130._0_4_ | (uint)!bVar16 * auVar133._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar151._4_4_ = (float)((uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * auVar133._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar151._8_4_ = (float)((uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * auVar133._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar151._12_4_ =
                 (float)((uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * auVar133._12_4_);
            bVar16 = (bool)((byte)(uVar101 >> 4) & 1);
            auVar151._16_4_ =
                 (float)((uint)bVar16 * auVar130._16_4_ | (uint)!bVar16 * auVar133._16_4_);
            bVar16 = (bool)((byte)(uVar101 >> 5) & 1);
            auVar151._20_4_ =
                 (float)((uint)bVar16 * auVar130._20_4_ | (uint)!bVar16 * auVar133._20_4_);
            bVar16 = (bool)((byte)(uVar101 >> 6) & 1);
            auVar151._24_4_ =
                 (float)((uint)bVar16 * auVar130._24_4_ | (uint)!bVar16 * auVar133._24_4_);
            bVar16 = SUB81(uVar101 >> 7,0);
            auVar151._28_4_ = (uint)bVar16 * auVar130._28_4_ | (uint)!bVar16 * auVar133._28_4_;
            vandps_avx512vl(auVar135,auVar148);
            vandps_avx512vl(auVar147,auVar148);
            auVar126 = vmaxps_avx(auVar151,auVar151);
            vandps_avx512vl(auVar124,auVar148);
            auVar126 = vmaxps_avx(auVar126,auVar151);
            uVar101 = vcmpps_avx512vl(auVar126,auVar97,1);
            bVar16 = (bool)((byte)uVar101 & 1);
            auVar152._0_4_ = (uint)bVar16 * auVar129._0_4_ | (uint)!bVar16 * auVar135._0_4_;
            bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar152._4_4_ = (uint)bVar16 * auVar129._4_4_ | (uint)!bVar16 * auVar135._4_4_;
            bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar152._8_4_ = (uint)bVar16 * auVar129._8_4_ | (uint)!bVar16 * auVar135._8_4_;
            bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar152._12_4_ = (uint)bVar16 * auVar129._12_4_ | (uint)!bVar16 * auVar135._12_4_;
            bVar16 = (bool)((byte)(uVar101 >> 4) & 1);
            auVar152._16_4_ = (uint)bVar16 * auVar129._16_4_ | (uint)!bVar16 * auVar135._16_4_;
            bVar16 = (bool)((byte)(uVar101 >> 5) & 1);
            auVar152._20_4_ = (uint)bVar16 * auVar129._20_4_ | (uint)!bVar16 * auVar135._20_4_;
            bVar16 = (bool)((byte)(uVar101 >> 6) & 1);
            auVar152._24_4_ = (uint)bVar16 * auVar129._24_4_ | (uint)!bVar16 * auVar135._24_4_;
            bVar16 = SUB81(uVar101 >> 7,0);
            auVar152._28_4_ = (uint)bVar16 * auVar129._28_4_ | (uint)!bVar16 * auVar135._28_4_;
            bVar16 = (bool)((byte)uVar101 & 1);
            auVar153._0_4_ = (float)((uint)bVar16 * auVar130._0_4_ | (uint)!bVar16 * auVar147._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar153._4_4_ = (float)((uint)bVar16 * auVar130._4_4_ | (uint)!bVar16 * auVar147._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar153._8_4_ = (float)((uint)bVar16 * auVar130._8_4_ | (uint)!bVar16 * auVar147._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar153._12_4_ =
                 (float)((uint)bVar16 * auVar130._12_4_ | (uint)!bVar16 * auVar147._12_4_);
            bVar16 = (bool)((byte)(uVar101 >> 4) & 1);
            auVar153._16_4_ =
                 (float)((uint)bVar16 * auVar130._16_4_ | (uint)!bVar16 * auVar147._16_4_);
            bVar16 = (bool)((byte)(uVar101 >> 5) & 1);
            auVar153._20_4_ =
                 (float)((uint)bVar16 * auVar130._20_4_ | (uint)!bVar16 * auVar147._20_4_);
            bVar16 = (bool)((byte)(uVar101 >> 6) & 1);
            auVar153._24_4_ =
                 (float)((uint)bVar16 * auVar130._24_4_ | (uint)!bVar16 * auVar147._24_4_);
            bVar16 = SUB81(uVar101 >> 7,0);
            auVar153._28_4_ = (uint)bVar16 * auVar130._28_4_ | (uint)!bVar16 * auVar147._28_4_;
            auVar222._8_4_ = 0x80000000;
            auVar222._0_8_ = 0x8000000080000000;
            auVar222._12_4_ = 0x80000000;
            auVar222._16_4_ = 0x80000000;
            auVar222._20_4_ = 0x80000000;
            auVar222._24_4_ = 0x80000000;
            auVar222._28_4_ = 0x80000000;
            auVar126 = vxorps_avx512vl(auVar152,auVar222);
            auVar147 = auVar230._0_32_;
            auVar124 = vfmadd213ps_avx512vl(auVar150,auVar150,auVar147);
            auVar116 = vfmadd231ps_fma(auVar124,auVar151,auVar151);
            auVar124 = vrsqrt14ps_avx512vl(ZEXT1632(auVar116));
            auVar229._8_4_ = 0xbf000000;
            auVar229._0_8_ = 0xbf000000bf000000;
            auVar229._12_4_ = 0xbf000000;
            auVar229._16_4_ = 0xbf000000;
            auVar229._20_4_ = 0xbf000000;
            auVar229._24_4_ = 0xbf000000;
            auVar229._28_4_ = 0xbf000000;
            fVar203 = auVar124._0_4_;
            fVar170 = auVar124._4_4_;
            fVar208 = auVar124._8_4_;
            fVar209 = auVar124._12_4_;
            fVar193 = auVar124._16_4_;
            fVar200 = auVar124._20_4_;
            fVar201 = auVar124._24_4_;
            auVar62._4_4_ = fVar170 * fVar170 * fVar170 * auVar116._4_4_ * -0.5;
            auVar62._0_4_ = fVar203 * fVar203 * fVar203 * auVar116._0_4_ * -0.5;
            auVar62._8_4_ = fVar208 * fVar208 * fVar208 * auVar116._8_4_ * -0.5;
            auVar62._12_4_ = fVar209 * fVar209 * fVar209 * auVar116._12_4_ * -0.5;
            auVar62._16_4_ = fVar193 * fVar193 * fVar193 * -0.0;
            auVar62._20_4_ = fVar200 * fVar200 * fVar200 * -0.0;
            auVar62._24_4_ = fVar201 * fVar201 * fVar201 * -0.0;
            auVar62._28_4_ = auVar151._28_4_;
            auVar135 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar124 = vfmadd231ps_avx512vl(auVar62,auVar135,auVar124);
            auVar63._4_4_ = auVar151._4_4_ * auVar124._4_4_;
            auVar63._0_4_ = auVar151._0_4_ * auVar124._0_4_;
            auVar63._8_4_ = auVar151._8_4_ * auVar124._8_4_;
            auVar63._12_4_ = auVar151._12_4_ * auVar124._12_4_;
            auVar63._16_4_ = auVar151._16_4_ * auVar124._16_4_;
            auVar63._20_4_ = auVar151._20_4_ * auVar124._20_4_;
            auVar63._24_4_ = auVar151._24_4_ * auVar124._24_4_;
            auVar63._28_4_ = 0;
            auVar64._4_4_ = auVar124._4_4_ * -auVar150._4_4_;
            auVar64._0_4_ = auVar124._0_4_ * -auVar150._0_4_;
            auVar64._8_4_ = auVar124._8_4_ * -auVar150._8_4_;
            auVar64._12_4_ = auVar124._12_4_ * -auVar150._12_4_;
            auVar64._16_4_ = auVar124._16_4_ * -auVar150._16_4_;
            auVar64._20_4_ = auVar124._20_4_ * -auVar150._20_4_;
            auVar64._24_4_ = auVar124._24_4_ * -auVar150._24_4_;
            auVar64._28_4_ = auVar151._28_4_;
            auVar134 = vmulps_avx512vl(auVar124,auVar147);
            auVar124 = vfmadd213ps_avx512vl(auVar152,auVar152,auVar147);
            auVar124 = vfmadd231ps_avx512vl(auVar124,auVar153,auVar153);
            auVar133 = vrsqrt14ps_avx512vl(auVar124);
            auVar124 = vmulps_avx512vl(auVar124,auVar229);
            fVar203 = auVar133._0_4_;
            fVar170 = auVar133._4_4_;
            fVar208 = auVar133._8_4_;
            fVar209 = auVar133._12_4_;
            fVar193 = auVar133._16_4_;
            fVar200 = auVar133._20_4_;
            fVar201 = auVar133._24_4_;
            auVar65._4_4_ = fVar170 * fVar170 * fVar170 * auVar124._4_4_;
            auVar65._0_4_ = fVar203 * fVar203 * fVar203 * auVar124._0_4_;
            auVar65._8_4_ = fVar208 * fVar208 * fVar208 * auVar124._8_4_;
            auVar65._12_4_ = fVar209 * fVar209 * fVar209 * auVar124._12_4_;
            auVar65._16_4_ = fVar193 * fVar193 * fVar193 * auVar124._16_4_;
            auVar65._20_4_ = fVar200 * fVar200 * fVar200 * auVar124._20_4_;
            auVar65._24_4_ = fVar201 * fVar201 * fVar201 * auVar124._24_4_;
            auVar65._28_4_ = auVar124._28_4_;
            auVar124 = vfmadd231ps_avx512vl(auVar65,auVar135,auVar133);
            auVar66._4_4_ = auVar153._4_4_ * auVar124._4_4_;
            auVar66._0_4_ = auVar153._0_4_ * auVar124._0_4_;
            auVar66._8_4_ = auVar153._8_4_ * auVar124._8_4_;
            auVar66._12_4_ = auVar153._12_4_ * auVar124._12_4_;
            auVar66._16_4_ = auVar153._16_4_ * auVar124._16_4_;
            auVar66._20_4_ = auVar153._20_4_ * auVar124._20_4_;
            auVar66._24_4_ = auVar153._24_4_ * auVar124._24_4_;
            auVar66._28_4_ = auVar133._28_4_;
            auVar67._4_4_ = auVar124._4_4_ * auVar126._4_4_;
            auVar67._0_4_ = auVar124._0_4_ * auVar126._0_4_;
            auVar67._8_4_ = auVar124._8_4_ * auVar126._8_4_;
            auVar67._12_4_ = auVar124._12_4_ * auVar126._12_4_;
            auVar67._16_4_ = auVar124._16_4_ * auVar126._16_4_;
            auVar67._20_4_ = auVar124._20_4_ * auVar126._20_4_;
            auVar67._24_4_ = auVar124._24_4_ * auVar126._24_4_;
            auVar67._28_4_ = auVar126._28_4_;
            auVar126 = vmulps_avx512vl(auVar124,auVar147);
            auVar116 = vfmadd213ps_fma(auVar63,auVar132,auVar123);
            auVar117 = vfmadd213ps_fma(auVar64,auVar132,auVar131);
            auVar135 = vfmadd213ps_avx512vl(auVar134,auVar132,auVar125);
            auVar133 = vfmadd213ps_avx512vl(auVar66,auVar146,auVar121);
            auVar10 = vfnmadd213ps_fma(auVar63,auVar132,auVar123);
            auVar115 = vfmadd213ps_fma(auVar67,auVar146,auVar122);
            auVar185 = vfnmadd213ps_fma(auVar64,auVar132,auVar131);
            auVar6 = vfmadd213ps_fma(auVar126,auVar146,auVar127);
            auVar119 = vfnmadd231ps_fma(auVar125,auVar132,auVar134);
            auVar186 = vfnmadd213ps_fma(auVar66,auVar146,auVar121);
            auVar118 = vfnmadd213ps_fma(auVar67,auVar146,auVar122);
            auVar187 = vfnmadd231ps_fma(auVar127,auVar146,auVar126);
            auVar127 = vsubps_avx512vl(auVar133,ZEXT1632(auVar10));
            auVar126 = vsubps_avx(ZEXT1632(auVar115),ZEXT1632(auVar185));
            auVar124 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar119));
            auVar68._4_4_ = auVar126._4_4_ * auVar119._4_4_;
            auVar68._0_4_ = auVar126._0_4_ * auVar119._0_4_;
            auVar68._8_4_ = auVar126._8_4_ * auVar119._8_4_;
            auVar68._12_4_ = auVar126._12_4_ * auVar119._12_4_;
            auVar68._16_4_ = auVar126._16_4_ * 0.0;
            auVar68._20_4_ = auVar126._20_4_ * 0.0;
            auVar68._24_4_ = auVar126._24_4_ * 0.0;
            auVar68._28_4_ = auVar134._28_4_;
            auVar7 = vfmsub231ps_fma(auVar68,ZEXT1632(auVar185),auVar124);
            auVar69._4_4_ = auVar124._4_4_ * auVar10._4_4_;
            auVar69._0_4_ = auVar124._0_4_ * auVar10._0_4_;
            auVar69._8_4_ = auVar124._8_4_ * auVar10._8_4_;
            auVar69._12_4_ = auVar124._12_4_ * auVar10._12_4_;
            auVar69._16_4_ = auVar124._16_4_ * 0.0;
            auVar69._20_4_ = auVar124._20_4_ * 0.0;
            auVar69._24_4_ = auVar124._24_4_ * 0.0;
            auVar69._28_4_ = auVar124._28_4_;
            auVar8 = vfmsub231ps_fma(auVar69,ZEXT1632(auVar119),auVar127);
            auVar70._4_4_ = auVar185._4_4_ * auVar127._4_4_;
            auVar70._0_4_ = auVar185._0_4_ * auVar127._0_4_;
            auVar70._8_4_ = auVar185._8_4_ * auVar127._8_4_;
            auVar70._12_4_ = auVar185._12_4_ * auVar127._12_4_;
            auVar70._16_4_ = auVar127._16_4_ * 0.0;
            auVar70._20_4_ = auVar127._20_4_ * 0.0;
            auVar70._24_4_ = auVar127._24_4_ * 0.0;
            auVar70._28_4_ = auVar127._28_4_;
            auVar9 = vfmsub231ps_fma(auVar70,ZEXT1632(auVar10),auVar126);
            auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar147,ZEXT1632(auVar8));
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar147,ZEXT1632(auVar7));
            uVar101 = vcmpps_avx512vl(auVar126,auVar147,2);
            bVar112 = (byte)uVar101;
            fVar113 = (float)((uint)(bVar112 & 1) * auVar116._0_4_ |
                             (uint)!(bool)(bVar112 & 1) * auVar186._0_4_);
            bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
            fVar164 = (float)((uint)bVar16 * auVar116._4_4_ | (uint)!bVar16 * auVar186._4_4_);
            bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
            fVar166 = (float)((uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * auVar186._8_4_);
            bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
            fVar168 = (float)((uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * auVar186._12_4_);
            auVar128 = ZEXT1632(CONCAT412(fVar168,CONCAT48(fVar166,CONCAT44(fVar164,fVar113))));
            fVar114 = (float)((uint)(bVar112 & 1) * auVar117._0_4_ |
                             (uint)!(bool)(bVar112 & 1) * auVar118._0_4_);
            bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
            fVar165 = (float)((uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * auVar118._4_4_);
            bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
            fVar167 = (float)((uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * auVar118._8_4_);
            bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
            fVar169 = (float)((uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * auVar118._12_4_);
            auVar129 = ZEXT1632(CONCAT412(fVar169,CONCAT48(fVar167,CONCAT44(fVar165,fVar114))));
            auVar154._0_4_ =
                 (float)((uint)(bVar112 & 1) * auVar135._0_4_ |
                        (uint)!(bool)(bVar112 & 1) * auVar187._0_4_);
            bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar154._4_4_ = (float)((uint)bVar16 * auVar135._4_4_ | (uint)!bVar16 * auVar187._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar154._8_4_ = (float)((uint)bVar16 * auVar135._8_4_ | (uint)!bVar16 * auVar187._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar154._12_4_ =
                 (float)((uint)bVar16 * auVar135._12_4_ | (uint)!bVar16 * auVar187._12_4_);
            fVar208 = (float)((uint)((byte)(uVar101 >> 4) & 1) * auVar135._16_4_);
            auVar154._16_4_ = fVar208;
            fVar170 = (float)((uint)((byte)(uVar101 >> 5) & 1) * auVar135._20_4_);
            auVar154._20_4_ = fVar170;
            fVar203 = (float)((uint)((byte)(uVar101 >> 6) & 1) * auVar135._24_4_);
            auVar154._24_4_ = fVar203;
            iVar1 = (uint)(byte)(uVar101 >> 7) * auVar135._28_4_;
            auVar154._28_4_ = iVar1;
            auVar126 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar133);
            auVar155._0_4_ =
                 (uint)(bVar112 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar112 & 1) * auVar7._0_4_;
            bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar155._4_4_ = (uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * auVar7._4_4_;
            bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar155._8_4_ = (uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * auVar7._8_4_;
            bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar155._12_4_ = (uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * auVar7._12_4_;
            auVar155._16_4_ = (uint)((byte)(uVar101 >> 4) & 1) * auVar126._16_4_;
            auVar155._20_4_ = (uint)((byte)(uVar101 >> 5) & 1) * auVar126._20_4_;
            auVar155._24_4_ = (uint)((byte)(uVar101 >> 6) & 1) * auVar126._24_4_;
            auVar155._28_4_ = (uint)(byte)(uVar101 >> 7) * auVar126._28_4_;
            auVar126 = vblendmps_avx512vl(ZEXT1632(auVar185),ZEXT1632(auVar115));
            auVar156._0_4_ =
                 (float)((uint)(bVar112 & 1) * auVar126._0_4_ |
                        (uint)!(bool)(bVar112 & 1) * auVar116._0_4_);
            bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar156._4_4_ = (float)((uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * auVar116._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar156._8_4_ = (float)((uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * auVar116._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar156._12_4_ =
                 (float)((uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * auVar116._12_4_);
            fVar209 = (float)((uint)((byte)(uVar101 >> 4) & 1) * auVar126._16_4_);
            auVar156._16_4_ = fVar209;
            fVar200 = (float)((uint)((byte)(uVar101 >> 5) & 1) * auVar126._20_4_);
            auVar156._20_4_ = fVar200;
            fVar193 = (float)((uint)((byte)(uVar101 >> 6) & 1) * auVar126._24_4_);
            auVar156._24_4_ = fVar193;
            auVar156._28_4_ = (uint)(byte)(uVar101 >> 7) * auVar126._28_4_;
            auVar126 = vblendmps_avx512vl(ZEXT1632(auVar119),ZEXT1632(auVar6));
            auVar157._0_4_ =
                 (float)((uint)(bVar112 & 1) * auVar126._0_4_ |
                        (uint)!(bool)(bVar112 & 1) * auVar117._0_4_);
            bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar157._4_4_ = (float)((uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * auVar117._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar157._8_4_ = (float)((uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * auVar117._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar157._12_4_ =
                 (float)((uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * auVar117._12_4_);
            fVar201 = (float)((uint)((byte)(uVar101 >> 4) & 1) * auVar126._16_4_);
            auVar157._16_4_ = fVar201;
            fVar202 = (float)((uint)((byte)(uVar101 >> 5) & 1) * auVar126._20_4_);
            auVar157._20_4_ = fVar202;
            fVar192 = (float)((uint)((byte)(uVar101 >> 6) & 1) * auVar126._24_4_);
            auVar157._24_4_ = fVar192;
            iVar2 = (uint)(byte)(uVar101 >> 7) * auVar126._28_4_;
            auVar157._28_4_ = iVar2;
            auVar158._0_4_ =
                 (uint)(bVar112 & 1) * (int)auVar10._0_4_ |
                 (uint)!(bool)(bVar112 & 1) * auVar133._0_4_;
            bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
            auVar158._4_4_ = (uint)bVar16 * (int)auVar10._4_4_ | (uint)!bVar16 * auVar133._4_4_;
            bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
            auVar158._8_4_ = (uint)bVar16 * (int)auVar10._8_4_ | (uint)!bVar16 * auVar133._8_4_;
            bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar158._12_4_ = (uint)bVar16 * (int)auVar10._12_4_ | (uint)!bVar16 * auVar133._12_4_;
            auVar158._16_4_ = (uint)!(bool)((byte)(uVar101 >> 4) & 1) * auVar133._16_4_;
            auVar158._20_4_ = (uint)!(bool)((byte)(uVar101 >> 5) & 1) * auVar133._20_4_;
            auVar158._24_4_ = (uint)!(bool)((byte)(uVar101 >> 6) & 1) * auVar133._24_4_;
            auVar158._28_4_ = (uint)!SUB81(uVar101 >> 7,0) * auVar133._28_4_;
            bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar101 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar101 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar101 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar101 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar101 >> 3) & 1);
            auVar133 = vsubps_avx512vl(auVar158,auVar128);
            auVar124 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar185._12_4_ |
                                                     (uint)!bVar20 * auVar115._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar185._8_4_ |
                                                              (uint)!bVar18 * auVar115._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar185._4_4_ |
                                                                       (uint)!bVar16 *
                                                                       auVar115._4_4_,
                                                                       (uint)(bVar112 & 1) *
                                                                       (int)auVar185._0_4_ |
                                                                       (uint)!(bool)(bVar112 & 1) *
                                                                       auVar115._0_4_)))),auVar129);
            auVar135 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar119._12_4_ |
                                                     (uint)!bVar21 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar119._8_4_ |
                                                              (uint)!bVar19 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar119._4_4_ |
                                                                       (uint)!bVar17 * auVar6._4_4_,
                                                                       (uint)(bVar112 & 1) *
                                                                       (int)auVar119._0_4_ |
                                                                       (uint)!(bool)(bVar112 & 1) *
                                                                       auVar6._0_4_)))),auVar154);
            auVar134 = vsubps_avx(auVar128,auVar155);
            auVar127 = vsubps_avx(auVar129,auVar156);
            auVar125 = vsubps_avx(auVar154,auVar157);
            auVar71._4_4_ = auVar135._4_4_ * fVar164;
            auVar71._0_4_ = auVar135._0_4_ * fVar113;
            auVar71._8_4_ = auVar135._8_4_ * fVar166;
            auVar71._12_4_ = auVar135._12_4_ * fVar168;
            auVar71._16_4_ = auVar135._16_4_ * 0.0;
            auVar71._20_4_ = auVar135._20_4_ * 0.0;
            auVar71._24_4_ = auVar135._24_4_ * 0.0;
            auVar71._28_4_ = 0;
            auVar116 = vfmsub231ps_fma(auVar71,auVar154,auVar133);
            auVar199._0_4_ = fVar114 * auVar133._0_4_;
            auVar199._4_4_ = fVar165 * auVar133._4_4_;
            auVar199._8_4_ = fVar167 * auVar133._8_4_;
            auVar199._12_4_ = fVar169 * auVar133._12_4_;
            auVar199._16_4_ = auVar133._16_4_ * 0.0;
            auVar199._20_4_ = auVar133._20_4_ * 0.0;
            auVar199._24_4_ = auVar133._24_4_ * 0.0;
            auVar199._28_4_ = 0;
            auVar117 = vfmsub231ps_fma(auVar199,auVar128,auVar124);
            auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),auVar147,ZEXT1632(auVar116));
            auVar206._0_4_ = auVar124._0_4_ * auVar154._0_4_;
            auVar206._4_4_ = auVar124._4_4_ * auVar154._4_4_;
            auVar206._8_4_ = auVar124._8_4_ * auVar154._8_4_;
            auVar206._12_4_ = auVar124._12_4_ * auVar154._12_4_;
            auVar206._16_4_ = auVar124._16_4_ * fVar208;
            auVar206._20_4_ = auVar124._20_4_ * fVar170;
            auVar206._24_4_ = auVar124._24_4_ * fVar203;
            auVar206._28_4_ = 0;
            auVar116 = vfmsub231ps_fma(auVar206,auVar129,auVar135);
            auVar130 = vfmadd231ps_avx512vl(auVar126,auVar147,ZEXT1632(auVar116));
            auVar126 = vmulps_avx512vl(auVar125,auVar155);
            auVar126 = vfmsub231ps_avx512vl(auVar126,auVar134,auVar157);
            auVar72._4_4_ = auVar127._4_4_ * auVar157._4_4_;
            auVar72._0_4_ = auVar127._0_4_ * auVar157._0_4_;
            auVar72._8_4_ = auVar127._8_4_ * auVar157._8_4_;
            auVar72._12_4_ = auVar127._12_4_ * auVar157._12_4_;
            auVar72._16_4_ = auVar127._16_4_ * fVar201;
            auVar72._20_4_ = auVar127._20_4_ * fVar202;
            auVar72._24_4_ = auVar127._24_4_ * fVar192;
            auVar72._28_4_ = iVar2;
            auVar116 = vfmsub231ps_fma(auVar72,auVar156,auVar125);
            auVar207._0_4_ = auVar156._0_4_ * auVar134._0_4_;
            auVar207._4_4_ = auVar156._4_4_ * auVar134._4_4_;
            auVar207._8_4_ = auVar156._8_4_ * auVar134._8_4_;
            auVar207._12_4_ = auVar156._12_4_ * auVar134._12_4_;
            auVar207._16_4_ = fVar209 * auVar134._16_4_;
            auVar207._20_4_ = fVar200 * auVar134._20_4_;
            auVar207._24_4_ = fVar193 * auVar134._24_4_;
            auVar207._28_4_ = 0;
            auVar117 = vfmsub231ps_fma(auVar207,auVar127,auVar155);
            auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar117),auVar147,auVar126);
            auVar123 = vfmadd231ps_avx512vl(auVar126,auVar147,ZEXT1632(auVar116));
            auVar126 = vmaxps_avx(auVar130,auVar123);
            uVar172 = vcmpps_avx512vl(auVar126,auVar147,2);
            local_670 = local_670 & (byte)uVar172;
            auVar237 = ZEXT3264(auVar225);
            if (local_670 == 0) {
LAB_01d91504:
              local_670 = 0;
            }
            else {
              auVar73._4_4_ = auVar125._4_4_ * auVar124._4_4_;
              auVar73._0_4_ = auVar125._0_4_ * auVar124._0_4_;
              auVar73._8_4_ = auVar125._8_4_ * auVar124._8_4_;
              auVar73._12_4_ = auVar125._12_4_ * auVar124._12_4_;
              auVar73._16_4_ = auVar125._16_4_ * auVar124._16_4_;
              auVar73._20_4_ = auVar125._20_4_ * auVar124._20_4_;
              auVar73._24_4_ = auVar125._24_4_ * auVar124._24_4_;
              auVar73._28_4_ = auVar126._28_4_;
              auVar115 = vfmsub231ps_fma(auVar73,auVar127,auVar135);
              auVar74._4_4_ = auVar135._4_4_ * auVar134._4_4_;
              auVar74._0_4_ = auVar135._0_4_ * auVar134._0_4_;
              auVar74._8_4_ = auVar135._8_4_ * auVar134._8_4_;
              auVar74._12_4_ = auVar135._12_4_ * auVar134._12_4_;
              auVar74._16_4_ = auVar135._16_4_ * auVar134._16_4_;
              auVar74._20_4_ = auVar135._20_4_ * auVar134._20_4_;
              auVar74._24_4_ = auVar135._24_4_ * auVar134._24_4_;
              auVar74._28_4_ = auVar135._28_4_;
              auVar117 = vfmsub231ps_fma(auVar74,auVar133,auVar125);
              auVar75._4_4_ = auVar127._4_4_ * auVar133._4_4_;
              auVar75._0_4_ = auVar127._0_4_ * auVar133._0_4_;
              auVar75._8_4_ = auVar127._8_4_ * auVar133._8_4_;
              auVar75._12_4_ = auVar127._12_4_ * auVar133._12_4_;
              auVar75._16_4_ = auVar127._16_4_ * auVar133._16_4_;
              auVar75._20_4_ = auVar127._20_4_ * auVar133._20_4_;
              auVar75._24_4_ = auVar127._24_4_ * auVar133._24_4_;
              auVar75._28_4_ = auVar127._28_4_;
              auVar6 = vfmsub231ps_fma(auVar75,auVar134,auVar124);
              auVar116 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar117),ZEXT1632(auVar6));
              auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar116),ZEXT1632(auVar115),auVar147);
              auVar124 = vrcp14ps_avx512vl(auVar126);
              auVar37._8_4_ = 0x3f800000;
              auVar37._0_8_ = &DAT_3f8000003f800000;
              auVar37._12_4_ = 0x3f800000;
              auVar37._16_4_ = 0x3f800000;
              auVar37._20_4_ = 0x3f800000;
              auVar37._24_4_ = 0x3f800000;
              auVar37._28_4_ = 0x3f800000;
              auVar135 = vfnmadd213ps_avx512vl(auVar124,auVar126,auVar37);
              auVar116 = vfmadd132ps_fma(auVar135,auVar124,auVar124);
              auVar76._4_4_ = auVar6._4_4_ * auVar154._4_4_;
              auVar76._0_4_ = auVar6._0_4_ * auVar154._0_4_;
              auVar76._8_4_ = auVar6._8_4_ * auVar154._8_4_;
              auVar76._12_4_ = auVar6._12_4_ * auVar154._12_4_;
              auVar76._16_4_ = fVar208 * 0.0;
              auVar76._20_4_ = fVar170 * 0.0;
              auVar76._24_4_ = fVar203 * 0.0;
              auVar76._28_4_ = iVar1;
              auVar117 = vfmadd231ps_fma(auVar76,auVar129,ZEXT1632(auVar117));
              auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar128,ZEXT1632(auVar115));
              fVar203 = auVar116._0_4_;
              fVar170 = auVar116._4_4_;
              fVar208 = auVar116._8_4_;
              fVar209 = auVar116._12_4_;
              auVar124 = ZEXT1632(CONCAT412(auVar117._12_4_ * fVar209,
                                            CONCAT48(auVar117._8_4_ * fVar208,
                                                     CONCAT44(auVar117._4_4_ * fVar170,
                                                              auVar117._0_4_ * fVar203))));
              auVar98._4_4_ = uStack_59c;
              auVar98._0_4_ = local_5a0;
              auVar98._8_4_ = uStack_598;
              auVar98._12_4_ = uStack_594;
              auVar98._16_4_ = uStack_590;
              auVar98._20_4_ = uStack_58c;
              auVar98._24_4_ = uStack_588;
              auVar98._28_4_ = uStack_584;
              uVar172 = vcmpps_avx512vl(auVar124,auVar98,0xd);
              uVar171 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar38._4_4_ = uVar171;
              auVar38._0_4_ = uVar171;
              auVar38._8_4_ = uVar171;
              auVar38._12_4_ = uVar171;
              auVar38._16_4_ = uVar171;
              auVar38._20_4_ = uVar171;
              auVar38._24_4_ = uVar171;
              auVar38._28_4_ = uVar171;
              uVar31 = vcmpps_avx512vl(auVar124,auVar38,2);
              local_670 = (byte)uVar172 & (byte)uVar31 & local_670;
              if (local_670 == 0) goto LAB_01d91504;
              uVar172 = vcmpps_avx512vl(auVar126,auVar147,4);
              if ((local_670 & (byte)uVar172) == 0) goto LAB_01d91504;
              local_670 = local_670 & (byte)uVar172;
              fVar193 = auVar130._0_4_ * fVar203;
              fVar200 = auVar130._4_4_ * fVar170;
              auVar77._4_4_ = fVar200;
              auVar77._0_4_ = fVar193;
              fVar201 = auVar130._8_4_ * fVar208;
              auVar77._8_4_ = fVar201;
              fVar202 = auVar130._12_4_ * fVar209;
              auVar77._12_4_ = fVar202;
              fVar192 = auVar130._16_4_ * 0.0;
              auVar77._16_4_ = fVar192;
              fVar113 = auVar130._20_4_ * 0.0;
              auVar77._20_4_ = fVar113;
              fVar114 = auVar130._24_4_ * 0.0;
              auVar77._24_4_ = fVar114;
              auVar77._28_4_ = auVar130._28_4_;
              fVar203 = auVar123._0_4_ * fVar203;
              fVar170 = auVar123._4_4_ * fVar170;
              auVar78._4_4_ = fVar170;
              auVar78._0_4_ = fVar203;
              fVar208 = auVar123._8_4_ * fVar208;
              auVar78._8_4_ = fVar208;
              fVar209 = auVar123._12_4_ * fVar209;
              auVar78._12_4_ = fVar209;
              fVar164 = auVar123._16_4_ * 0.0;
              auVar78._16_4_ = fVar164;
              fVar165 = auVar123._20_4_ * 0.0;
              auVar78._20_4_ = fVar165;
              fVar166 = auVar123._24_4_ * 0.0;
              auVar78._24_4_ = fVar166;
              auVar78._28_4_ = auVar123._28_4_;
              auVar217._8_4_ = 0x3f800000;
              auVar217._0_8_ = &DAT_3f8000003f800000;
              auVar217._12_4_ = 0x3f800000;
              auVar217._16_4_ = 0x3f800000;
              auVar217._20_4_ = 0x3f800000;
              auVar217._24_4_ = 0x3f800000;
              auVar217._28_4_ = 0x3f800000;
              auVar126 = vsubps_avx(auVar217,auVar77);
              local_900._0_4_ =
                   (uint)(bVar112 & 1) * (int)fVar193 | (uint)!(bool)(bVar112 & 1) * auVar126._0_4_;
              bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
              local_900._4_4_ = (uint)bVar16 * (int)fVar200 | (uint)!bVar16 * auVar126._4_4_;
              bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
              local_900._8_4_ = (uint)bVar16 * (int)fVar201 | (uint)!bVar16 * auVar126._8_4_;
              bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
              local_900._12_4_ = (uint)bVar16 * (int)fVar202 | (uint)!bVar16 * auVar126._12_4_;
              bVar16 = (bool)((byte)(uVar101 >> 4) & 1);
              local_900._16_4_ = (uint)bVar16 * (int)fVar192 | (uint)!bVar16 * auVar126._16_4_;
              bVar16 = (bool)((byte)(uVar101 >> 5) & 1);
              local_900._20_4_ = (uint)bVar16 * (int)fVar113 | (uint)!bVar16 * auVar126._20_4_;
              bVar16 = (bool)((byte)(uVar101 >> 6) & 1);
              local_900._24_4_ = (uint)bVar16 * (int)fVar114 | (uint)!bVar16 * auVar126._24_4_;
              bVar16 = SUB81(uVar101 >> 7,0);
              local_900._28_4_ = (uint)bVar16 * auVar130._28_4_ | (uint)!bVar16 * auVar126._28_4_;
              auVar126 = vsubps_avx(auVar217,auVar78);
              local_5c0._0_4_ =
                   (uint)(bVar112 & 1) * (int)fVar203 | (uint)!(bool)(bVar112 & 1) * auVar126._0_4_;
              bVar16 = (bool)((byte)(uVar101 >> 1) & 1);
              local_5c0._4_4_ = (uint)bVar16 * (int)fVar170 | (uint)!bVar16 * auVar126._4_4_;
              bVar16 = (bool)((byte)(uVar101 >> 2) & 1);
              local_5c0._8_4_ = (uint)bVar16 * (int)fVar208 | (uint)!bVar16 * auVar126._8_4_;
              bVar16 = (bool)((byte)(uVar101 >> 3) & 1);
              local_5c0._12_4_ = (uint)bVar16 * (int)fVar209 | (uint)!bVar16 * auVar126._12_4_;
              bVar16 = (bool)((byte)(uVar101 >> 4) & 1);
              local_5c0._16_4_ = (uint)bVar16 * (int)fVar164 | (uint)!bVar16 * auVar126._16_4_;
              bVar16 = (bool)((byte)(uVar101 >> 5) & 1);
              local_5c0._20_4_ = (uint)bVar16 * (int)fVar165 | (uint)!bVar16 * auVar126._20_4_;
              bVar16 = (bool)((byte)(uVar101 >> 6) & 1);
              local_5c0._24_4_ = (uint)bVar16 * (int)fVar166 | (uint)!bVar16 * auVar126._24_4_;
              bVar16 = SUB81(uVar101 >> 7,0);
              local_5c0._28_4_ = (uint)bVar16 * auVar123._28_4_ | (uint)!bVar16 * auVar126._28_4_;
              local_920 = auVar124;
            }
            if (local_670 != 0) {
              auVar126 = vsubps_avx(auVar146,auVar132);
              auVar116 = vfmadd213ps_fma(auVar126,local_900,auVar132);
              uVar171 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar39._4_4_ = uVar171;
              auVar39._0_4_ = uVar171;
              auVar39._8_4_ = uVar171;
              auVar39._12_4_ = uVar171;
              auVar39._16_4_ = uVar171;
              auVar39._20_4_ = uVar171;
              auVar39._24_4_ = uVar171;
              auVar39._28_4_ = uVar171;
              auVar126 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar116._12_4_ + auVar116._12_4_,
                                                            CONCAT48(auVar116._8_4_ + auVar116._8_4_
                                                                     ,CONCAT44(auVar116._4_4_ +
                                                                               auVar116._4_4_,
                                                                               auVar116._0_4_ +
                                                                               auVar116._0_4_)))),
                                         auVar39);
              uVar172 = vcmpps_avx512vl(local_920,auVar126,6);
              local_670 = local_670 & (byte)uVar172;
              uVar107 = (uint)local_670;
              if (local_670 != 0) {
                auVar180._8_4_ = 0xbf800000;
                auVar180._0_8_ = 0xbf800000bf800000;
                auVar180._12_4_ = 0xbf800000;
                auVar180._16_4_ = 0xbf800000;
                auVar180._20_4_ = 0xbf800000;
                auVar180._24_4_ = 0xbf800000;
                auVar180._28_4_ = 0xbf800000;
                auVar40._8_4_ = 0x40000000;
                auVar40._0_8_ = 0x4000000040000000;
                auVar40._12_4_ = 0x40000000;
                auVar40._16_4_ = 0x40000000;
                auVar40._20_4_ = 0x40000000;
                auVar40._24_4_ = 0x40000000;
                auVar40._28_4_ = 0x40000000;
                local_700 = vfmadd132ps_avx512vl(local_5c0,auVar180,auVar40);
                local_5c0 = local_700;
                auVar126 = local_5c0;
                local_6c0 = (undefined4)lVar108;
                local_6b0 = local_9a0;
                uStack_6a8 = uStack_998;
                local_6a0 = local_930._0_8_;
                uStack_698 = local_930._8_8_;
                local_690 = local_950._0_8_;
                uStack_688 = local_950._8_8_;
                local_680 = local_940;
                uStack_678 = uStack_938;
                pGVar110 = (context->scene->geometries).items[uVar111].ptr;
                local_5c0 = auVar126;
                if ((pGVar110->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar116 = vcvtsi2ss_avx512f(auVar148._0_16_,local_6c0);
                  fVar203 = auVar116._0_4_;
                  local_660[0] = (fVar203 + local_900._0_4_ + 0.0) * (float)local_740._0_4_;
                  local_660[1] = (fVar203 + local_900._4_4_ + 1.0) * (float)local_740._4_4_;
                  local_660[2] = (fVar203 + local_900._8_4_ + 2.0) * fStack_738;
                  local_660[3] = (fVar203 + local_900._12_4_ + 3.0) * fStack_734;
                  fStack_650 = (fVar203 + local_900._16_4_ + 4.0) * fStack_730;
                  fStack_64c = (fVar203 + local_900._20_4_ + 5.0) * fStack_72c;
                  fStack_648 = (fVar203 + local_900._24_4_ + 6.0) * fStack_728;
                  fStack_644 = fVar203 + local_900._28_4_ + 7.0;
                  local_5c0._0_8_ = local_700._0_8_;
                  local_5c0._8_8_ = local_700._8_8_;
                  local_5c0._16_8_ = local_700._16_8_;
                  local_5c0._24_8_ = local_700._24_8_;
                  local_640 = local_5c0._0_8_;
                  uStack_638 = local_5c0._8_8_;
                  uStack_630 = local_5c0._16_8_;
                  uStack_628 = local_5c0._24_8_;
                  local_620 = local_920;
                  auVar181._8_4_ = 0x7f800000;
                  auVar181._0_8_ = 0x7f8000007f800000;
                  auVar181._12_4_ = 0x7f800000;
                  auVar181._16_4_ = 0x7f800000;
                  auVar181._20_4_ = 0x7f800000;
                  auVar181._24_4_ = 0x7f800000;
                  auVar181._28_4_ = 0x7f800000;
                  auVar126 = vblendmps_avx512vl(auVar181,local_920);
                  auVar159._0_4_ =
                       (uint)(local_670 & 1) * auVar126._0_4_ |
                       (uint)!(bool)(local_670 & 1) * 0x7f800000;
                  bVar16 = (bool)(local_670 >> 1 & 1);
                  auVar159._4_4_ = (uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_670 >> 2 & 1);
                  auVar159._8_4_ = (uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_670 >> 3 & 1);
                  auVar159._12_4_ = (uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_670 >> 4 & 1);
                  auVar159._16_4_ = (uint)bVar16 * auVar126._16_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_670 >> 5 & 1);
                  auVar159._20_4_ = (uint)bVar16 * auVar126._20_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_670 >> 6 & 1);
                  auVar159._24_4_ = (uint)bVar16 * auVar126._24_4_ | (uint)!bVar16 * 0x7f800000;
                  auVar159._28_4_ =
                       (uint)(local_670 >> 7) * auVar126._28_4_ |
                       (uint)!(bool)(local_670 >> 7) * 0x7f800000;
                  auVar126 = vshufps_avx(auVar159,auVar159,0xb1);
                  auVar126 = vminps_avx(auVar159,auVar126);
                  auVar124 = vshufpd_avx(auVar126,auVar126,5);
                  auVar126 = vminps_avx(auVar126,auVar124);
                  auVar124 = vpermpd_avx2(auVar126,0x4e);
                  auVar126 = vminps_avx(auVar126,auVar124);
                  uVar172 = vcmpps_avx512vl(auVar159,auVar126,0);
                  bVar100 = (byte)uVar172 & local_670;
                  bVar112 = local_670;
                  if (bVar100 != 0) {
                    bVar112 = bVar100;
                  }
                  uVar103 = 0;
                  for (uVar104 = (uint)bVar112; (uVar104 & 1) == 0;
                      uVar104 = uVar104 >> 1 | 0x80000000) {
                    uVar103 = uVar103 + 1;
                  }
                  uVar101 = (ulong)uVar103;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar110->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar203 = local_660[uVar101];
                    uVar171 = *(undefined4 *)((long)&local_640 + uVar101 * 4);
                    fVar208 = 1.0 - fVar203;
                    fVar170 = fVar208 * fVar208 * -3.0;
                    auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * fVar208)),
                                               ZEXT416((uint)(fVar203 * fVar208)),
                                               ZEXT416(0xc0000000));
                    auVar117 = vfmsub132ss_fma(ZEXT416((uint)(fVar203 * fVar208)),
                                               ZEXT416((uint)(fVar203 * fVar203)),
                                               ZEXT416(0x40000000));
                    fVar208 = auVar116._0_4_ * 3.0;
                    fVar209 = auVar117._0_4_ * 3.0;
                    fVar193 = fVar203 * fVar203 * 3.0;
                    auVar211._0_4_ = fVar193 * (float)local_940._0_4_;
                    auVar211._4_4_ = fVar193 * (float)local_940._4_4_;
                    auVar211._8_4_ = fVar193 * (float)uStack_938;
                    auVar211._12_4_ = fVar193 * uStack_938._4_4_;
                    auVar190._4_4_ = fVar209;
                    auVar190._0_4_ = fVar209;
                    auVar190._8_4_ = fVar209;
                    auVar190._12_4_ = fVar209;
                    auVar116 = vfmadd132ps_fma(auVar190,auVar211,local_950);
                    auVar195._4_4_ = fVar208;
                    auVar195._0_4_ = fVar208;
                    auVar195._8_4_ = fVar208;
                    auVar195._12_4_ = fVar208;
                    auVar116 = vfmadd132ps_fma(auVar195,auVar116,local_930);
                    auVar191._4_4_ = fVar170;
                    auVar191._0_4_ = fVar170;
                    auVar191._8_4_ = fVar170;
                    auVar191._12_4_ = fVar170;
                    auVar116 = vfmadd132ps_fma(auVar191,auVar116,auVar30);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar101 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar116._0_4_;
                    uVar3 = vextractps_avx(auVar116,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar3;
                    uVar3 = vextractps_avx(auVar116,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar3;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar203;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar171;
                    *(uint *)(ray + k * 4 + 0x440) = uVar12;
                    *(uint *)(ray + k * 4 + 0x480) = uVar111;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    local_800 = local_930._0_8_;
                    uStack_7f8 = local_930._8_8_;
                    local_810 = local_950._0_8_;
                    uStack_808 = local_950._8_8_;
                    local_820 = local_940;
                    uStack_818 = uStack_938;
                    local_560 = vmovdqa64_avx512vl(auVar238._0_32_);
                    local_960 = pGVar110;
                    local_720 = local_900;
                    local_6e0 = local_920;
                    local_6bc = iVar13;
                    do {
                      auVar115 = auVar230._0_16_;
                      local_480._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar101]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)((long)&local_640 + uVar101 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) =
                           *(undefined4 *)(local_620 + uVar101 * 4);
                      local_990.context = context->user;
                      fVar209 = local_200._0_4_;
                      fVar170 = 1.0 - fVar209;
                      fVar203 = fVar170 * fVar170 * -3.0;
                      auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170)),
                                                 ZEXT416((uint)(fVar209 * fVar170)),
                                                 ZEXT416(0xc0000000));
                      auVar117 = vfmsub132ss_fma(ZEXT416((uint)(fVar209 * fVar170)),
                                                 ZEXT416((uint)(fVar209 * fVar209)),
                                                 ZEXT416(0x40000000));
                      fVar170 = auVar116._0_4_ * 3.0;
                      fVar208 = auVar117._0_4_ * 3.0;
                      fVar209 = fVar209 * fVar209 * 3.0;
                      auVar212._0_4_ = fVar209 * (float)local_820;
                      auVar212._4_4_ = fVar209 * local_820._4_4_;
                      auVar212._8_4_ = fVar209 * (float)uStack_818;
                      auVar212._12_4_ = fVar209 * uStack_818._4_4_;
                      auVar173._4_4_ = fVar208;
                      auVar173._0_4_ = fVar208;
                      auVar173._8_4_ = fVar208;
                      auVar173._12_4_ = fVar208;
                      auVar93._8_8_ = uStack_808;
                      auVar93._0_8_ = local_810;
                      auVar116 = vfmadd132ps_fma(auVar173,auVar212,auVar93);
                      auVar196._4_4_ = fVar170;
                      auVar196._0_4_ = fVar170;
                      auVar196._8_4_ = fVar170;
                      auVar196._12_4_ = fVar170;
                      auVar95._8_8_ = uStack_7f8;
                      auVar95._0_8_ = local_800;
                      auVar116 = vfmadd132ps_fma(auVar196,auVar116,auVar95);
                      auVar174._4_4_ = fVar203;
                      auVar174._0_4_ = fVar203;
                      auVar174._8_4_ = fVar203;
                      auVar174._12_4_ = fVar203;
                      auVar116 = vfmadd132ps_fma(auVar174,auVar116,auVar30);
                      auVar162 = vbroadcastss_avx512f(auVar116);
                      auVar163 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar163,ZEXT1664(auVar116));
                      auVar163 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar163,ZEXT1664(auVar116));
                      local_2c0[0] = (RTCHitN)auVar162[0];
                      local_2c0[1] = (RTCHitN)auVar162[1];
                      local_2c0[2] = (RTCHitN)auVar162[2];
                      local_2c0[3] = (RTCHitN)auVar162[3];
                      local_2c0[4] = (RTCHitN)auVar162[4];
                      local_2c0[5] = (RTCHitN)auVar162[5];
                      local_2c0[6] = (RTCHitN)auVar162[6];
                      local_2c0[7] = (RTCHitN)auVar162[7];
                      local_2c0[8] = (RTCHitN)auVar162[8];
                      local_2c0[9] = (RTCHitN)auVar162[9];
                      local_2c0[10] = (RTCHitN)auVar162[10];
                      local_2c0[0xb] = (RTCHitN)auVar162[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar162[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar162[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar162[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar162[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar162[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar162[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar162[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar162[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar162[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar162[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar162[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar162[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar162[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar162[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar162[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar162[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar162[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar162[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar162[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar162[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar162[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar162[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar162[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar162[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar162[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar162[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar162[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar162[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar162[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar162[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar162[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar162[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar162[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar162[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar162[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar162[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar162[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar162[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar162[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar162[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar162[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar162[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar162[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar162[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar162[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar162[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar162[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar162[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar162[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar162[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar162[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar162[0x3f];
                      local_180 = local_440._0_8_;
                      uStack_178 = local_440._8_8_;
                      uStack_170 = local_440._16_8_;
                      uStack_168 = local_440._24_8_;
                      uStack_160 = local_440._32_8_;
                      uStack_158 = local_440._40_8_;
                      uStack_150 = local_440._48_8_;
                      uStack_148 = local_440._56_8_;
                      auVar162 = vmovdqa64_avx512f(local_4c0);
                      local_140 = vmovdqa64_avx512f(auVar162);
                      auVar126 = vpcmpeqd_avx2(auVar162._0_32_,auVar162._0_32_);
                      local_958[3] = auVar126;
                      local_958[2] = auVar126;
                      local_958[1] = auVar126;
                      *local_958 = auVar126;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_990.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_990.context)->instPrimID[0]));
                      local_600 = local_300;
                      local_990.valid = (int *)local_600;
                      local_990.geometryUserPtr = pGVar110->userPtr;
                      local_990.hit = local_2c0;
                      local_990.N = 0x10;
                      local_500._0_4_ = uVar107;
                      local_990.ray = (RTCRayN *)ray;
                      if (pGVar110->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar110->intersectionFilterN)(&local_990);
                        auVar126 = vmovdqa64_avx512vl(local_560);
                        auVar238 = ZEXT3264(auVar126);
                        auVar235 = ZEXT3264(local_8a0);
                        auVar234 = ZEXT3264(local_880);
                        auVar236 = ZEXT3264(local_860);
                        auVar184 = ZEXT3264(local_840);
                        auVar237 = ZEXT3264(local_7c0);
                        auVar233 = ZEXT3264(local_7a0);
                        auVar232 = ZEXT3264(local_780);
                        auVar231 = ZEXT3264(local_760);
                        auVar116 = vxorps_avx512vl(auVar115,auVar115);
                        auVar230 = ZEXT1664(auVar116);
                        pGVar110 = local_960;
                        uVar107 = local_500._0_4_;
                      }
                      bVar112 = (byte)uVar107;
                      auVar116 = auVar230._0_16_;
                      auVar162 = vmovdqa64_avx512f(local_600);
                      uVar172 = vptestmd_avx512f(auVar162,auVar162);
                      if ((short)uVar172 == 0) {
LAB_01d9196d:
                        *(undefined4 *)(ray + k * 4 + 0x200) = local_480._0_4_;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar110->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var15)(&local_990);
                          bVar112 = local_500[0];
                          auVar126 = vmovdqa64_avx512vl(local_560);
                          auVar238 = ZEXT3264(auVar126);
                          auVar235 = ZEXT3264(local_8a0);
                          auVar234 = ZEXT3264(local_880);
                          auVar236 = ZEXT3264(local_860);
                          auVar184 = ZEXT3264(local_840);
                          auVar237 = ZEXT3264(local_7c0);
                          auVar233 = ZEXT3264(local_7a0);
                          auVar232 = ZEXT3264(local_780);
                          auVar231 = ZEXT3264(local_760);
                          auVar116 = vxorps_avx512vl(auVar116,auVar116);
                          auVar230 = ZEXT1664(auVar116);
                          pGVar110 = local_960;
                        }
                        auVar162 = vmovdqa64_avx512f(local_600);
                        uVar105 = vptestmd_avx512f(auVar162,auVar162);
                        if ((short)uVar105 == 0) goto LAB_01d9196d;
                        iVar1 = *(int *)(local_990.hit + 4);
                        iVar2 = *(int *)(local_990.hit + 8);
                        iVar80 = *(int *)(local_990.hit + 0xc);
                        iVar81 = *(int *)(local_990.hit + 0x10);
                        iVar82 = *(int *)(local_990.hit + 0x14);
                        iVar83 = *(int *)(local_990.hit + 0x18);
                        iVar84 = *(int *)(local_990.hit + 0x1c);
                        iVar85 = *(int *)(local_990.hit + 0x20);
                        iVar86 = *(int *)(local_990.hit + 0x24);
                        iVar87 = *(int *)(local_990.hit + 0x28);
                        iVar88 = *(int *)(local_990.hit + 0x2c);
                        iVar89 = *(int *)(local_990.hit + 0x30);
                        iVar90 = *(int *)(local_990.hit + 0x34);
                        iVar91 = *(int *)(local_990.hit + 0x38);
                        iVar92 = *(int *)(local_990.hit + 0x3c);
                        bVar100 = (byte)uVar105;
                        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar105 >> 7) & 1);
                        bVar99 = (byte)(uVar105 >> 8);
                        bVar23 = (bool)((byte)(uVar105 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar105 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar105 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar105 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar105 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar105 >> 0xe) & 1);
                        bVar29 = SUB81(uVar105 >> 0xf,0);
                        *(uint *)(local_990.ray + 0x300) =
                             (uint)(bVar100 & 1) * *(int *)local_990.hit |
                             (uint)!(bool)(bVar100 & 1) * *(int *)(local_990.ray + 0x300);
                        *(uint *)(local_990.ray + 0x304) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_990.ray + 0x304);
                        *(uint *)(local_990.ray + 0x308) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_990.ray + 0x308);
                        *(uint *)(local_990.ray + 0x30c) =
                             (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_990.ray + 0x30c)
                        ;
                        *(uint *)(local_990.ray + 0x310) =
                             (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_990.ray + 0x310)
                        ;
                        *(uint *)(local_990.ray + 0x314) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_990.ray + 0x314)
                        ;
                        *(uint *)(local_990.ray + 0x318) =
                             (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_990.ray + 0x318)
                        ;
                        *(uint *)(local_990.ray + 0x31c) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_990.ray + 0x31c)
                        ;
                        *(uint *)(local_990.ray + 800) =
                             (uint)(bVar99 & 1) * iVar85 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_990.ray + 800);
                        *(uint *)(local_990.ray + 0x324) =
                             (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_990.ray + 0x324)
                        ;
                        *(uint *)(local_990.ray + 0x328) =
                             (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_990.ray + 0x328)
                        ;
                        *(uint *)(local_990.ray + 0x32c) =
                             (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_990.ray + 0x32c)
                        ;
                        *(uint *)(local_990.ray + 0x330) =
                             (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_990.ray + 0x330)
                        ;
                        *(uint *)(local_990.ray + 0x334) =
                             (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_990.ray + 0x334)
                        ;
                        *(uint *)(local_990.ray + 0x338) =
                             (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_990.ray + 0x338)
                        ;
                        *(uint *)(local_990.ray + 0x33c) =
                             (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_990.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_990.hit + 0x44);
                        iVar2 = *(int *)(local_990.hit + 0x48);
                        iVar80 = *(int *)(local_990.hit + 0x4c);
                        iVar81 = *(int *)(local_990.hit + 0x50);
                        iVar82 = *(int *)(local_990.hit + 0x54);
                        iVar83 = *(int *)(local_990.hit + 0x58);
                        iVar84 = *(int *)(local_990.hit + 0x5c);
                        iVar85 = *(int *)(local_990.hit + 0x60);
                        iVar86 = *(int *)(local_990.hit + 100);
                        iVar87 = *(int *)(local_990.hit + 0x68);
                        iVar88 = *(int *)(local_990.hit + 0x6c);
                        iVar89 = *(int *)(local_990.hit + 0x70);
                        iVar90 = *(int *)(local_990.hit + 0x74);
                        iVar91 = *(int *)(local_990.hit + 0x78);
                        iVar92 = *(int *)(local_990.hit + 0x7c);
                        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar105 >> 7) & 1);
                        bVar23 = (bool)((byte)(uVar105 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar105 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar105 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar105 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar105 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar105 >> 0xe) & 1);
                        bVar29 = SUB81(uVar105 >> 0xf,0);
                        *(uint *)(local_990.ray + 0x340) =
                             (uint)(bVar100 & 1) * *(int *)(local_990.hit + 0x40) |
                             (uint)!(bool)(bVar100 & 1) * *(int *)(local_990.ray + 0x340);
                        *(uint *)(local_990.ray + 0x344) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_990.ray + 0x344);
                        *(uint *)(local_990.ray + 0x348) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_990.ray + 0x348);
                        *(uint *)(local_990.ray + 0x34c) =
                             (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_990.ray + 0x34c)
                        ;
                        *(uint *)(local_990.ray + 0x350) =
                             (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_990.ray + 0x350)
                        ;
                        *(uint *)(local_990.ray + 0x354) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_990.ray + 0x354)
                        ;
                        *(uint *)(local_990.ray + 0x358) =
                             (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_990.ray + 0x358)
                        ;
                        *(uint *)(local_990.ray + 0x35c) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_990.ray + 0x35c)
                        ;
                        *(uint *)(local_990.ray + 0x360) =
                             (uint)(bVar99 & 1) * iVar85 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_990.ray + 0x360);
                        *(uint *)(local_990.ray + 0x364) =
                             (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_990.ray + 0x364)
                        ;
                        *(uint *)(local_990.ray + 0x368) =
                             (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_990.ray + 0x368)
                        ;
                        *(uint *)(local_990.ray + 0x36c) =
                             (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_990.ray + 0x36c)
                        ;
                        *(uint *)(local_990.ray + 0x370) =
                             (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_990.ray + 0x370)
                        ;
                        *(uint *)(local_990.ray + 0x374) =
                             (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_990.ray + 0x374)
                        ;
                        *(uint *)(local_990.ray + 0x378) =
                             (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_990.ray + 0x378)
                        ;
                        *(uint *)(local_990.ray + 0x37c) =
                             (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_990.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_990.hit + 0x84);
                        iVar2 = *(int *)(local_990.hit + 0x88);
                        iVar80 = *(int *)(local_990.hit + 0x8c);
                        iVar81 = *(int *)(local_990.hit + 0x90);
                        iVar82 = *(int *)(local_990.hit + 0x94);
                        iVar83 = *(int *)(local_990.hit + 0x98);
                        iVar84 = *(int *)(local_990.hit + 0x9c);
                        iVar85 = *(int *)(local_990.hit + 0xa0);
                        iVar86 = *(int *)(local_990.hit + 0xa4);
                        iVar87 = *(int *)(local_990.hit + 0xa8);
                        iVar88 = *(int *)(local_990.hit + 0xac);
                        iVar89 = *(int *)(local_990.hit + 0xb0);
                        iVar90 = *(int *)(local_990.hit + 0xb4);
                        iVar91 = *(int *)(local_990.hit + 0xb8);
                        iVar92 = *(int *)(local_990.hit + 0xbc);
                        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar105 >> 7) & 1);
                        bVar23 = (bool)((byte)(uVar105 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar105 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar105 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar105 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar105 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar105 >> 0xe) & 1);
                        bVar29 = SUB81(uVar105 >> 0xf,0);
                        *(uint *)(local_990.ray + 0x380) =
                             (uint)(bVar100 & 1) * *(int *)(local_990.hit + 0x80) |
                             (uint)!(bool)(bVar100 & 1) * *(int *)(local_990.ray + 0x380);
                        *(uint *)(local_990.ray + 900) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_990.ray + 900);
                        *(uint *)(local_990.ray + 0x388) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_990.ray + 0x388);
                        *(uint *)(local_990.ray + 0x38c) =
                             (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_990.ray + 0x38c)
                        ;
                        *(uint *)(local_990.ray + 0x390) =
                             (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_990.ray + 0x390)
                        ;
                        *(uint *)(local_990.ray + 0x394) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_990.ray + 0x394)
                        ;
                        *(uint *)(local_990.ray + 0x398) =
                             (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_990.ray + 0x398)
                        ;
                        *(uint *)(local_990.ray + 0x39c) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_990.ray + 0x39c)
                        ;
                        *(uint *)(local_990.ray + 0x3a0) =
                             (uint)(bVar99 & 1) * iVar85 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_990.ray + 0x3a0);
                        *(uint *)(local_990.ray + 0x3a4) =
                             (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_990.ray + 0x3a4)
                        ;
                        *(uint *)(local_990.ray + 0x3a8) =
                             (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_990.ray + 0x3a8)
                        ;
                        *(uint *)(local_990.ray + 0x3ac) =
                             (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_990.ray + 0x3ac)
                        ;
                        *(uint *)(local_990.ray + 0x3b0) =
                             (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_990.ray + 0x3b0)
                        ;
                        *(uint *)(local_990.ray + 0x3b4) =
                             (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_990.ray + 0x3b4)
                        ;
                        *(uint *)(local_990.ray + 0x3b8) =
                             (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_990.ray + 0x3b8)
                        ;
                        *(uint *)(local_990.ray + 0x3bc) =
                             (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_990.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_990.hit + 0xc4);
                        iVar2 = *(int *)(local_990.hit + 200);
                        iVar80 = *(int *)(local_990.hit + 0xcc);
                        iVar81 = *(int *)(local_990.hit + 0xd0);
                        iVar82 = *(int *)(local_990.hit + 0xd4);
                        iVar83 = *(int *)(local_990.hit + 0xd8);
                        iVar84 = *(int *)(local_990.hit + 0xdc);
                        iVar85 = *(int *)(local_990.hit + 0xe0);
                        iVar86 = *(int *)(local_990.hit + 0xe4);
                        iVar87 = *(int *)(local_990.hit + 0xe8);
                        iVar88 = *(int *)(local_990.hit + 0xec);
                        iVar89 = *(int *)(local_990.hit + 0xf0);
                        iVar90 = *(int *)(local_990.hit + 0xf4);
                        iVar91 = *(int *)(local_990.hit + 0xf8);
                        iVar92 = *(int *)(local_990.hit + 0xfc);
                        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar105 >> 7) & 1);
                        bVar23 = (bool)((byte)(uVar105 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar105 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar105 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar105 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar105 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar105 >> 0xe) & 1);
                        bVar29 = SUB81(uVar105 >> 0xf,0);
                        *(uint *)(local_990.ray + 0x3c0) =
                             (uint)(bVar100 & 1) * *(int *)(local_990.hit + 0xc0) |
                             (uint)!(bool)(bVar100 & 1) * *(int *)(local_990.ray + 0x3c0);
                        *(uint *)(local_990.ray + 0x3c4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_990.ray + 0x3c4);
                        *(uint *)(local_990.ray + 0x3c8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_990.ray + 0x3c8);
                        *(uint *)(local_990.ray + 0x3cc) =
                             (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_990.ray + 0x3cc)
                        ;
                        *(uint *)(local_990.ray + 0x3d0) =
                             (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_990.ray + 0x3d0)
                        ;
                        *(uint *)(local_990.ray + 0x3d4) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_990.ray + 0x3d4)
                        ;
                        *(uint *)(local_990.ray + 0x3d8) =
                             (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_990.ray + 0x3d8)
                        ;
                        *(uint *)(local_990.ray + 0x3dc) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_990.ray + 0x3dc)
                        ;
                        *(uint *)(local_990.ray + 0x3e0) =
                             (uint)(bVar99 & 1) * iVar85 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_990.ray + 0x3e0);
                        *(uint *)(local_990.ray + 0x3e4) =
                             (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_990.ray + 0x3e4)
                        ;
                        *(uint *)(local_990.ray + 1000) =
                             (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_990.ray + 1000);
                        *(uint *)(local_990.ray + 0x3ec) =
                             (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_990.ray + 0x3ec)
                        ;
                        *(uint *)(local_990.ray + 0x3f0) =
                             (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_990.ray + 0x3f0)
                        ;
                        *(uint *)(local_990.ray + 0x3f4) =
                             (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_990.ray + 0x3f4)
                        ;
                        *(uint *)(local_990.ray + 0x3f8) =
                             (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_990.ray + 0x3f8)
                        ;
                        *(uint *)(local_990.ray + 0x3fc) =
                             (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_990.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_990.hit + 0x104);
                        iVar2 = *(int *)(local_990.hit + 0x108);
                        iVar80 = *(int *)(local_990.hit + 0x10c);
                        iVar81 = *(int *)(local_990.hit + 0x110);
                        iVar82 = *(int *)(local_990.hit + 0x114);
                        iVar83 = *(int *)(local_990.hit + 0x118);
                        iVar84 = *(int *)(local_990.hit + 0x11c);
                        iVar85 = *(int *)(local_990.hit + 0x120);
                        iVar86 = *(int *)(local_990.hit + 0x124);
                        iVar87 = *(int *)(local_990.hit + 0x128);
                        iVar88 = *(int *)(local_990.hit + 300);
                        iVar89 = *(int *)(local_990.hit + 0x130);
                        iVar90 = *(int *)(local_990.hit + 0x134);
                        iVar91 = *(int *)(local_990.hit + 0x138);
                        iVar92 = *(int *)(local_990.hit + 0x13c);
                        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar105 >> 7) & 1);
                        bVar23 = (bool)((byte)(uVar105 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar105 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar105 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar105 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar105 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar105 >> 0xe) & 1);
                        bVar29 = SUB81(uVar105 >> 0xf,0);
                        *(uint *)(local_990.ray + 0x400) =
                             (uint)(bVar100 & 1) * *(int *)(local_990.hit + 0x100) |
                             (uint)!(bool)(bVar100 & 1) * *(int *)(local_990.ray + 0x400);
                        *(uint *)(local_990.ray + 0x404) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_990.ray + 0x404);
                        *(uint *)(local_990.ray + 0x408) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_990.ray + 0x408);
                        *(uint *)(local_990.ray + 0x40c) =
                             (uint)bVar18 * iVar80 | (uint)!bVar18 * *(int *)(local_990.ray + 0x40c)
                        ;
                        *(uint *)(local_990.ray + 0x410) =
                             (uint)bVar19 * iVar81 | (uint)!bVar19 * *(int *)(local_990.ray + 0x410)
                        ;
                        *(uint *)(local_990.ray + 0x414) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_990.ray + 0x414)
                        ;
                        *(uint *)(local_990.ray + 0x418) =
                             (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_990.ray + 0x418)
                        ;
                        *(uint *)(local_990.ray + 0x41c) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_990.ray + 0x41c)
                        ;
                        *(uint *)(local_990.ray + 0x420) =
                             (uint)(bVar99 & 1) * iVar85 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_990.ray + 0x420);
                        *(uint *)(local_990.ray + 0x424) =
                             (uint)bVar23 * iVar86 | (uint)!bVar23 * *(int *)(local_990.ray + 0x424)
                        ;
                        *(uint *)(local_990.ray + 0x428) =
                             (uint)bVar24 * iVar87 | (uint)!bVar24 * *(int *)(local_990.ray + 0x428)
                        ;
                        *(uint *)(local_990.ray + 0x42c) =
                             (uint)bVar25 * iVar88 | (uint)!bVar25 * *(int *)(local_990.ray + 0x42c)
                        ;
                        *(uint *)(local_990.ray + 0x430) =
                             (uint)bVar26 * iVar89 | (uint)!bVar26 * *(int *)(local_990.ray + 0x430)
                        ;
                        *(uint *)(local_990.ray + 0x434) =
                             (uint)bVar27 * iVar90 | (uint)!bVar27 * *(int *)(local_990.ray + 0x434)
                        ;
                        *(uint *)(local_990.ray + 0x438) =
                             (uint)bVar28 * iVar91 | (uint)!bVar28 * *(int *)(local_990.ray + 0x438)
                        ;
                        *(uint *)(local_990.ray + 0x43c) =
                             (uint)bVar29 * iVar92 | (uint)!bVar29 * *(int *)(local_990.ray + 0x43c)
                        ;
                        auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_990.hit + 0x140));
                        auVar162 = vmovdqu32_avx512f(auVar162);
                        *(undefined1 (*) [64])(local_990.ray + 0x440) = auVar162;
                        auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_990.hit + 0x180));
                        auVar162 = vmovdqu32_avx512f(auVar162);
                        *(undefined1 (*) [64])(local_990.ray + 0x480) = auVar162;
                        auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_990.hit + 0x1c0));
                        auVar162 = vmovdqa32_avx512f(auVar162);
                        *(undefined1 (*) [64])(local_990.ray + 0x4c0) = auVar162;
                        auVar162 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_990.hit + 0x200));
                        auVar162 = vmovdqa32_avx512f(auVar162);
                        *(undefined1 (*) [64])(local_990.ray + 0x500) = auVar162;
                      }
                      bVar112 = ~(byte)(1 << ((uint)uVar101 & 0x1f)) & bVar112;
                      uVar171 = *(undefined4 *)(ray + k * 4 + 0x200);
                      auVar41._4_4_ = uVar171;
                      auVar41._0_4_ = uVar171;
                      auVar41._8_4_ = uVar171;
                      auVar41._12_4_ = uVar171;
                      auVar41._16_4_ = uVar171;
                      auVar41._20_4_ = uVar171;
                      auVar41._24_4_ = uVar171;
                      auVar41._28_4_ = uVar171;
                      uVar172 = vcmpps_avx512vl(local_920,auVar41,2);
                      bVar100 = bVar112 & (byte)uVar172;
                      uVar107 = (uint)bVar100;
                      if ((bVar112 & (byte)uVar172) != 0) {
                        auVar182._8_4_ = 0x7f800000;
                        auVar182._0_8_ = 0x7f8000007f800000;
                        auVar182._12_4_ = 0x7f800000;
                        auVar182._16_4_ = 0x7f800000;
                        auVar182._20_4_ = 0x7f800000;
                        auVar182._24_4_ = 0x7f800000;
                        auVar182._28_4_ = 0x7f800000;
                        auVar126 = vblendmps_avx512vl(auVar182,local_920);
                        auVar160._0_4_ =
                             (uint)(bVar100 & 1) * auVar126._0_4_ |
                             (uint)!(bool)(bVar100 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar100 >> 1 & 1);
                        auVar160._4_4_ = (uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar100 >> 2 & 1);
                        auVar160._8_4_ = (uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar100 >> 3 & 1);
                        auVar160._12_4_ =
                             (uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar100 >> 4 & 1);
                        auVar160._16_4_ =
                             (uint)bVar16 * auVar126._16_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar100 >> 5 & 1);
                        auVar160._20_4_ =
                             (uint)bVar16 * auVar126._20_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar100 >> 6 & 1);
                        auVar160._24_4_ =
                             (uint)bVar16 * auVar126._24_4_ | (uint)!bVar16 * 0x7f800000;
                        auVar160._28_4_ =
                             (uint)(bVar100 >> 7) * auVar126._28_4_ |
                             (uint)!(bool)(bVar100 >> 7) * 0x7f800000;
                        auVar126 = vshufps_avx(auVar160,auVar160,0xb1);
                        auVar126 = vminps_avx(auVar160,auVar126);
                        auVar124 = vshufpd_avx(auVar126,auVar126,5);
                        auVar126 = vminps_avx(auVar126,auVar124);
                        auVar124 = vpermpd_avx2(auVar126,0x4e);
                        auVar126 = vminps_avx(auVar126,auVar124);
                        uVar172 = vcmpps_avx512vl(auVar160,auVar126,0);
                        bVar112 = (byte)uVar172 & bVar100;
                        uVar103 = uVar107;
                        if (bVar112 != 0) {
                          uVar103 = (uint)bVar112;
                        }
                        uVar104 = 0;
                        for (; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x80000000) {
                          uVar104 = uVar104 + 1;
                        }
                        uVar101 = (ulong)uVar104;
                      }
                    } while (bVar100 != 0);
                  }
                }
              }
            }
          }
          lVar108 = lVar108 + 8;
        } while ((int)lVar108 < iVar13);
      }
      uVar171 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar36._4_4_ = uVar171;
      auVar36._0_4_ = uVar171;
      auVar36._8_4_ = uVar171;
      auVar36._12_4_ = uVar171;
      auVar36._16_4_ = uVar171;
      auVar36._20_4_ = uVar171;
      auVar36._24_4_ = uVar171;
      auVar36._28_4_ = uVar171;
      uVar172 = vcmpps_avx512vl(local_320,auVar36,2);
      uVar111 = (uint)uVar109 & (uint)uVar109 + 0xff & (uint)uVar172;
      uVar109 = (ulong)uVar111;
    } while (uVar111 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }